

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar8;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  _func_int *p_Var12;
  int *piVar13;
  void *pvVar14;
  _func_int **pp_Var15;
  Layer *pLVar16;
  void *pvVar17;
  void *pvVar18;
  size_t sVar19;
  bool bVar20;
  byte bVar21;
  undefined8 uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  float afVar37 [16];
  float afVar38 [16];
  float afVar39 [16];
  float afVar40 [16];
  float afVar41 [16];
  float afVar42 [16];
  float afVar43 [16];
  float afVar44 [16];
  float afVar45 [16];
  float afVar46 [16];
  float afVar47 [16];
  float afVar48 [16];
  float afVar49 [16];
  float afVar50 [16];
  float afVar51 [16];
  float afVar52 [16];
  float afVar53 [16];
  Option OVar54;
  undefined1 auVar55 [48];
  undefined1 auVar56 [36];
  Mat *pMVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  _func_int *p_Var64;
  int iVar65;
  ulong uVar66;
  long lVar67;
  float *pfVar68;
  int _h;
  int iVar69;
  ulong uVar70;
  size_t sVar71;
  uint uVar72;
  long lVar73;
  undefined1 (*pauVar74) [64];
  undefined1 (*pauVar75) [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 (*pauVar76) [16];
  int iVar77;
  uint uVar78;
  int iVar79;
  int iVar80;
  uint uVar81;
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  int _w;
  float fVar143;
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  float fVar147;
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  v4sf one;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar180 [64];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_2f8;
  long local_2e0;
  int local_2d8;
  uint local_2c8;
  int local_2a8;
  Mat local_258;
  undefined8 local_208;
  undefined1 local_1f8 [24];
  int iStack_1e0;
  Allocator *pAStack_1d8;
  undefined8 uStack_1d0;
  int iStack_1c8;
  int iStack_1c4;
  int iStack_1c0;
  undefined1 auStack_1dc [36];
  size_t local_1b8;
  int local_1a8;
  int iStack_1a4;
  undefined8 uStack_1a0;
  ulong local_190;
  undefined1 local_188 [40];
  undefined1 local_160 [16];
  int local_150;
  size_t local_148;
  Mat *local_140;
  undefined1 local_138 [16];
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Allocator *local_118;
  int local_110;
  Allocator *local_108;
  undefined1 local_100 [16];
  int local_f0;
  ulong local_e8;
  void *local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  ulong local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined1 local_b0 [16];
  int local_a0;
  ulong local_98;
  undefined1 local_88 [16];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  undefined1 auVar96 [16];
  undefined1 auVar119 [32];
  
  auVar82 = in_ZMM29._0_16_;
  uVar11 = bottom_blob->elemsize;
  iVar80 = bottom_blob->elempack;
  p_Var64 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  uVar72 = 1;
  if (opt->use_packing_layout == true) {
    uVar72 = *(uint *)(&this->field_0xd0 + (long)p_Var64);
    if ((uVar72 & 0xf) == 0) {
      uVar72 = 0x10;
    }
    else if ((uVar72 & 7) == 0) {
      uVar72 = 8;
    }
    else {
      uVar72 = (uint)((uVar72 & 3) == 0) * 3 + 1;
    }
  }
  uVar4 = bottom_blob->w;
  uVar8 = bottom_blob->h;
  auVar84._4_4_ = uVar8;
  auVar84._0_4_ = uVar4;
  uVar70 = *(ulong *)(&this->field_0xd4 + (long)p_Var64);
  uVar5 = *(ulong *)(&this->field_0xe4 + (long)p_Var64);
  uVar6 = *(ulong *)(&this->field_0xdc + (long)p_Var64);
  uVar7 = *(ulong *)(&this->field_0xfc + (long)p_Var64);
  uVar81 = bottom_blob->c;
  uVar66 = (ulong)uVar81;
  local_258.cstep = 0;
  auVar83 = (undefined1  [16])0x0;
  local_258.data = (void *)0x0;
  local_258.refcount._0_4_ = 0;
  local_258.refcount._4_4_ = 0;
  local_258.elemsize = 0;
  local_258.elempack = 0;
  local_258.allocator = (Allocator *)0x0;
  local_258.dims = 0;
  local_258.w = 0;
  local_258.h = 0;
  local_258.d = 0;
  local_258.c = 0;
  p_Var12 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  p_Var64 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 + (long)p_Var12);
  lVar67 = 0x10;
  if (((((*(int *)(&this->field_0xec + (long)p_Var12) < 1) && (*(int *)(p_Var64 + 0xf0) < 1)) &&
       (*(int *)(p_Var64 + 0xf4) < 1)) && (*(int *)(p_Var64 + 0xf8) < 1)) &&
     ((*(int *)(p_Var64 + 0x104) < 1 || (*(int *)(p_Var64 + 0x108) < 1)))) {
    auVar83 = (undefined1  [16])0x0;
    if (&local_258 != top_blob) {
      piVar13 = top_blob->refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_258.data = top_blob->data;
      local_258.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_258.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_258.elemsize = top_blob->elemsize;
      local_258.elempack = top_blob->elempack;
      local_258.allocator = top_blob->allocator;
      auVar83._0_4_ = top_blob->dims;
      auVar83._4_4_ = top_blob->w;
      uVar9 = top_blob->h;
      uVar10 = top_blob->d;
      auVar83._8_8_ = CONCAT44(uVar10,uVar9);
      local_258.c = top_blob->c;
      local_258.cstep = top_blob->cstep;
      local_258.dims = auVar83._0_4_;
      local_258.w = auVar83._4_4_;
      local_258._48_8_ = auVar83._8_8_;
    }
    p_Var64 = (_func_int *)
              ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 +
              (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]);
    lVar67 = 8;
  }
  auVar84._8_8_ = 0;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar7;
  uStack_1a0 = 0;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar6;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar5;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar70;
  auVar85 = vpcmpeqd_avx(auVar83,auVar83);
  auVar83 = vpaddd_avx(auVar84,auVar85);
  auVar83 = vpmulld_avx(auVar88,auVar83);
  auVar83 = vpaddd_avx(auVar83,auVar89);
  auVar84 = vpaddd_avx(auVar86,auVar85);
  local_88 = vpmulld_avx(auVar84,auVar87);
  auVar83 = vpaddd_avx(local_88,auVar83);
  local_138 = vpsubd_avx(auVar83,auVar85);
  sVar71 = (uVar11 / (ulong)(long)iVar80) * (ulong)uVar72;
  _w = local_138._0_4_;
  _h = local_138._4_4_;
  local_1a8 = uVar4;
  iStack_1a4 = uVar8;
  local_140 = top_blob;
  Mat::create(&local_258,_w,_h,*(int *)(p_Var64 + 0xd0) / (int)uVar72,sVar71,uVar72,
              *(Allocator **)(&opt->lightmode + lVar67));
  iVar69 = iStack_1a4;
  iVar61 = local_1a8;
  pvVar14 = local_258.data;
  afVar53 = _ps512_cephes_log_p8;
  afVar52 = _ps512_cephes_log_p7;
  afVar51 = _ps512_cephes_log_p6;
  afVar50 = _ps512_cephes_log_p5;
  afVar49 = _ps512_cephes_log_p4;
  afVar48 = _ps512_cephes_log_p3;
  afVar47 = _ps512_cephes_log_p2;
  afVar46 = _ps512_cephes_exp_p5;
  afVar45 = _ps512_cephes_exp_p4;
  afVar44 = _ps512_cephes_exp_p3;
  afVar43 = _ps512_cephes_exp_p2;
  afVar42 = _ps512_cephes_exp_p1;
  afVar41 = _ps512_cephes_exp_p0;
  afVar40 = _ps512_cephes_LOG2EF;
  afVar39 = _ps512_exp_lo;
  afVar38 = _ps512_exp_hi;
  afVar37 = _ps512_1;
  if ((local_258.data == (void *)0x0) || ((long)local_258.c * local_258.cstep == 0)) {
    iVar80 = -100;
    goto LAB_00491655;
  }
  p_Var64 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  iVar77 = *(int *)(&this->field_0x114 + (long)p_Var64);
  if ((uVar81 * iVar80 == iVar77) && (iVar77 == *(int *)(&this->field_0xd0 + (long)p_Var64))) {
    uVar72 = *(int *)(&this->field_0xd8 + (long)p_Var64) *
             *(int *)(&this->field_0xd4 + (long)p_Var64);
    local_190 = (ulong)uVar72;
    uVar2 = local_88._4_4_;
    if (7 < iVar80) {
      if (iVar80 != 8) {
        if ((iVar80 == 0x10) && (0 < (int)uVar81)) {
          uVar11 = vpcmpd_avx512vl((undefined1  [16])0x0,local_138,1);
          auVar144 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar128 = vxorps_avx512dq(auVar144,(undefined1  [64])_ps512_cephes_log_q2);
          auVar129 = vxorps_avx512dq(auVar144,(undefined1  [64])_ps512_cephes_log_q1);
          auVar130 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
          auVar131 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar144);
          local_2f8 = 0;
          auVar82 = vxorps_avx512vl(auVar82,auVar82);
          auVar180 = ZEXT1664(auVar82);
          auVar132 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar133 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
          do {
            if (((uVar11 & 0xf) >> 1 & 1) != 0) {
              pvVar14 = (this->weight_data_tm).data;
              sVar71 = bottom_blob->elemsize;
              local_208 = (void *)(bottom_blob->cstep * local_2f8 * sVar71 + (long)bottom_blob->data
                                  );
              iVar80 = bottom_blob->w;
              pauVar74 = (undefined1 (*) [64])
                         (local_258.cstep * local_2f8 * local_258.elemsize + (long)local_258.data);
              pp_Var15 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
              iVar61 = 0;
              do {
                if ((uVar11 & 1) != 0) {
                  iVar69 = 0;
                  local_2a8 = -local_88._0_4_;
                  do {
                    p_Var64 = pp_Var15[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var64) == 0) {
                      auVar134 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar134 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                    (*(long *)(&this->field_0x1b0 + (long)p_Var64) +
                                                    local_2f8 * 0x40));
                    }
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
                      iVar79 = 0;
                      iVar77 = 0;
                      do {
                        iVar58 = *(int *)(&this->field_0xe0 + (long)p_Var64) * iVar77 +
                                 (iVar61 - local_88._4_4_);
                        if (((-1 < iVar58) &&
                            (iVar59 = iVar58 / *(int *)(&this->field_0xe8 + (long)p_Var64),
                            iVar58 % *(int *)(&this->field_0xe8 + (long)p_Var64) == 0)) &&
                           (iVar59 < iStack_1a4)) {
                          lVar67 = (long)*(int *)(&this->field_0xd4 + (long)p_Var64);
                          if (0 < lVar67) {
                            uVar81 = *(int *)(&this->field_0xd4 + (long)p_Var64) * iVar79;
                            iVar58 = local_2a8;
                            do {
                              if (((-1 < iVar58) &&
                                  (iVar60 = iVar58 / *(int *)(&this->field_0xe4 + (long)p_Var64),
                                  iVar58 % *(int *)(&this->field_0xe4 + (long)p_Var64) == 0)) &&
                                 (iVar60 < local_1a8)) {
                                auVar134 = vfmadd231ps_avx512f(auVar134,*(undefined1 (*) [64])
                                                                         ((long)local_208 +
                                                                         (long)(iVar60 << 4) * 4 +
                                                                         (long)iVar59 *
                                                                         (long)iVar80 * sVar71),
                                                               *(undefined1 (*) [64])
                                                                ((long)pvVar14 +
                                                                (ulong)uVar81 * 4 +
                                                                (long)(int)(uVar72 * 0x10 *
                                                                           (int)local_2f8) * 4));
                              }
                              uVar81 = uVar81 + 0x10;
                              iVar58 = iVar58 + *(int *)(&this->field_0xdc + (long)p_Var64);
                              lVar67 = lVar67 + -1;
                            } while (lVar67 != 0);
                          }
                        }
                        iVar77 = iVar77 + 1;
                        iVar79 = iVar79 + 0x10;
                      } while (iVar77 != *(int *)(&this->field_0xd8 + (long)p_Var64));
                    }
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var64)) {
                    case 1:
                      auVar134 = vmaxps_avx512f(auVar134,auVar180);
                      break;
                    case 2:
                      uVar70 = vcmpps_avx512f(auVar134,auVar180,1);
                      uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                      auVar36._4_4_ = uVar2;
                      auVar36._0_4_ = uVar2;
                      auVar36._8_4_ = uVar2;
                      auVar36._12_4_ = uVar2;
                      auVar36._16_4_ = uVar2;
                      auVar36._20_4_ = uVar2;
                      auVar36._24_4_ = uVar2;
                      auVar36._28_4_ = uVar2;
                      auVar36._32_4_ = uVar2;
                      auVar36._36_4_ = uVar2;
                      auVar36._40_4_ = uVar2;
                      auVar36._44_4_ = uVar2;
                      auVar36._48_4_ = uVar2;
                      auVar36._52_4_ = uVar2;
                      auVar36._56_4_ = uVar2;
                      auVar36._60_4_ = uVar2;
                      auVar142 = vmulps_avx512f(auVar134,auVar36);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar140._0_4_ =
                           (uint)bVar20 * auVar142._0_4_ | (uint)!bVar20 * auVar134._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar140._4_4_ =
                           (uint)bVar20 * auVar142._4_4_ | (uint)!bVar20 * auVar134._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar140._8_4_ =
                           (uint)bVar20 * auVar142._8_4_ | (uint)!bVar20 * auVar134._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar140._12_4_ =
                           (uint)bVar20 * auVar142._12_4_ | (uint)!bVar20 * auVar134._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar140._16_4_ =
                           (uint)bVar20 * auVar142._16_4_ | (uint)!bVar20 * auVar134._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar140._20_4_ =
                           (uint)bVar20 * auVar142._20_4_ | (uint)!bVar20 * auVar134._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar140._24_4_ =
                           (uint)bVar20 * auVar142._24_4_ | (uint)!bVar20 * auVar134._24_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar140._28_4_ =
                           (uint)bVar20 * auVar142._28_4_ | (uint)!bVar20 * auVar134._28_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar140._32_4_ =
                           (uint)bVar20 * auVar142._32_4_ | (uint)!bVar20 * auVar134._32_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar140._36_4_ =
                           (uint)bVar20 * auVar142._36_4_ | (uint)!bVar20 * auVar134._36_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar140._40_4_ =
                           (uint)bVar20 * auVar142._40_4_ | (uint)!bVar20 * auVar134._40_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar140._44_4_ =
                           (uint)bVar20 * auVar142._44_4_ | (uint)!bVar20 * auVar134._44_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar140._48_4_ =
                           (uint)bVar20 * auVar142._48_4_ | (uint)!bVar20 * auVar134._48_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar140._52_4_ =
                           (uint)bVar20 * auVar142._52_4_ | (uint)!bVar20 * auVar134._52_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar140._56_4_ =
                           (uint)bVar20 * auVar142._56_4_ | (uint)!bVar20 * auVar134._56_4_;
                      bVar20 = SUB81(uVar70 >> 0xf,0);
                      auVar140._60_4_ =
                           (uint)bVar20 * auVar142._60_4_ | (uint)!bVar20 * auVar134._60_4_;
                      auVar134 = auVar140;
                      break;
                    case 3:
                      uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                      auVar35._4_4_ = uVar2;
                      auVar35._0_4_ = uVar2;
                      auVar35._8_4_ = uVar2;
                      auVar35._12_4_ = uVar2;
                      auVar35._16_4_ = uVar2;
                      auVar35._20_4_ = uVar2;
                      auVar35._24_4_ = uVar2;
                      auVar35._28_4_ = uVar2;
                      auVar35._32_4_ = uVar2;
                      auVar35._36_4_ = uVar2;
                      auVar35._40_4_ = uVar2;
                      auVar35._44_4_ = uVar2;
                      auVar35._48_4_ = uVar2;
                      auVar35._52_4_ = uVar2;
                      auVar35._56_4_ = uVar2;
                      auVar35._60_4_ = uVar2;
                      auVar142 = vmaxps_avx512f(auVar134,auVar35);
                      uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var64))[1];
                      auVar134._4_4_ = uVar2;
                      auVar134._0_4_ = uVar2;
                      auVar134._8_4_ = uVar2;
                      auVar134._12_4_ = uVar2;
                      auVar134._16_4_ = uVar2;
                      auVar134._20_4_ = uVar2;
                      auVar134._24_4_ = uVar2;
                      auVar134._28_4_ = uVar2;
                      auVar134._32_4_ = uVar2;
                      auVar134._36_4_ = uVar2;
                      auVar134._40_4_ = uVar2;
                      auVar134._44_4_ = uVar2;
                      auVar134._48_4_ = uVar2;
                      auVar134._52_4_ = uVar2;
                      auVar134._56_4_ = uVar2;
                      auVar134._60_4_ = uVar2;
                      auVar134 = vminps_avx512f(auVar142,auVar134);
                      break;
                    case 4:
                      auVar134 = vxorps_avx512dq(auVar134,auVar144);
                      auVar134 = vminps_avx512f(auVar134,(undefined1  [64])afVar38);
                      auVar134 = vmaxps_avx512f(auVar134,(undefined1  [64])afVar39);
                      auVar142 = vfmadd213ps_avx512f((undefined1  [64])afVar40,auVar134,
                                                     (undefined1  [64])afVar46);
                      auVar141 = vrndscaleps_avx512f(auVar142,1);
                      uVar70 = vcmpps_avx512f(auVar142,auVar141,1);
                      auVar142 = vsubps_avx512f(auVar141,(undefined1  [64])afVar37);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar139._0_4_ =
                           (uint)bVar20 * auVar142._0_4_ | (uint)!bVar20 * auVar141._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar139._4_4_ =
                           (uint)bVar20 * auVar142._4_4_ | (uint)!bVar20 * auVar141._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar139._8_4_ =
                           (uint)bVar20 * auVar142._8_4_ | (uint)!bVar20 * auVar141._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar139._12_4_ =
                           (uint)bVar20 * auVar142._12_4_ | (uint)!bVar20 * auVar141._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar139._16_4_ =
                           (uint)bVar20 * auVar142._16_4_ | (uint)!bVar20 * auVar141._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar139._20_4_ =
                           (uint)bVar20 * auVar142._20_4_ | (uint)!bVar20 * auVar141._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar139._24_4_ =
                           (uint)bVar20 * auVar142._24_4_ | (uint)!bVar20 * auVar141._24_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar139._28_4_ =
                           (uint)bVar20 * auVar142._28_4_ | (uint)!bVar20 * auVar141._28_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar139._32_4_ =
                           (uint)bVar20 * auVar142._32_4_ | (uint)!bVar20 * auVar141._32_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar139._36_4_ =
                           (uint)bVar20 * auVar142._36_4_ | (uint)!bVar20 * auVar141._36_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar139._40_4_ =
                           (uint)bVar20 * auVar142._40_4_ | (uint)!bVar20 * auVar141._40_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar139._44_4_ =
                           (uint)bVar20 * auVar142._44_4_ | (uint)!bVar20 * auVar141._44_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar139._48_4_ =
                           (uint)bVar20 * auVar142._48_4_ | (uint)!bVar20 * auVar141._48_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar139._52_4_ =
                           (uint)bVar20 * auVar142._52_4_ | (uint)!bVar20 * auVar141._52_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar139._56_4_ =
                           (uint)bVar20 * auVar142._56_4_ | (uint)!bVar20 * auVar141._56_4_;
                      bVar20 = SUB81(uVar70 >> 0xf,0);
                      auVar139._60_4_ =
                           (uint)bVar20 * auVar142._60_4_ | (uint)!bVar20 * auVar141._60_4_;
                      auVar134 = vfmadd231ps_avx512f(auVar134,auVar139,auVar128);
                      auVar134 = vfmadd231ps_avx512f(auVar134,auVar139,auVar129);
                      auVar142 = vmulps_avx512f(auVar134,auVar134);
                      auVar141 = vfmadd213ps_avx512f(auVar134,(undefined1  [64])afVar41,
                                                     (undefined1  [64])afVar42);
                      auVar141 = vfmadd213ps_avx512f(auVar141,auVar134,(undefined1  [64])afVar43);
                      auVar141 = vfmadd213ps_avx512f(auVar141,auVar134,(undefined1  [64])afVar44);
                      auVar141 = vfmadd213ps_avx512f(auVar141,auVar134,(undefined1  [64])afVar45);
                      auVar141 = vfmadd213ps_avx512f(auVar141,auVar134,(undefined1  [64])afVar46);
                      auVar134 = vfmadd213ps_avx512f(auVar141,auVar142,auVar134);
                      auVar134 = vaddps_avx512f(auVar134,(undefined1  [64])afVar37);
                      auVar142 = vcvttps2dq_avx512f(auVar139);
                      auVar142 = vpaddd_avx512f(auVar130,auVar142);
                      auVar142 = vpslld_avx512f(auVar142,0x17);
                      auVar134 = vfmadd213ps_avx512f(auVar142,auVar134,auVar132);
                      auVar142 = vrcp14ps_avx512f(auVar134);
                      auVar134 = vfmsub213ps_avx512f(auVar134,auVar142,auVar132);
                      auVar134 = vfnmadd132ps_avx512vl(auVar134,auVar142,auVar142);
                      break;
                    case 5:
                      auVar142 = vminps_avx512f(auVar134,(undefined1  [64])afVar38);
                      auVar142 = vmaxps_avx512f(auVar142,(undefined1  [64])afVar39);
                      auVar141 = vfmadd213ps_avx512f((undefined1  [64])afVar40,auVar142,
                                                     (undefined1  [64])afVar46);
                      auVar135 = vrndscaleps_avx512f(auVar141,1);
                      uVar70 = vcmpps_avx512f(auVar141,auVar135,1);
                      auVar136 = vsubps_avx512f(auVar135,(undefined1  [64])afVar37);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar141._0_4_ =
                           (uint)bVar20 * auVar136._0_4_ | (uint)!bVar20 * auVar135._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar141._4_4_ =
                           (uint)bVar20 * auVar136._4_4_ | (uint)!bVar20 * auVar135._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar141._8_4_ =
                           (uint)bVar20 * auVar136._8_4_ | (uint)!bVar20 * auVar135._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar141._12_4_ =
                           (uint)bVar20 * auVar136._12_4_ | (uint)!bVar20 * auVar135._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar141._16_4_ =
                           (uint)bVar20 * auVar136._16_4_ | (uint)!bVar20 * auVar135._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar141._20_4_ =
                           (uint)bVar20 * auVar136._20_4_ | (uint)!bVar20 * auVar135._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar141._24_4_ =
                           (uint)bVar20 * auVar136._24_4_ | (uint)!bVar20 * auVar135._24_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar141._28_4_ =
                           (uint)bVar20 * auVar136._28_4_ | (uint)!bVar20 * auVar135._28_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar141._32_4_ =
                           (uint)bVar20 * auVar136._32_4_ | (uint)!bVar20 * auVar135._32_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar141._36_4_ =
                           (uint)bVar20 * auVar136._36_4_ | (uint)!bVar20 * auVar135._36_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar141._40_4_ =
                           (uint)bVar20 * auVar136._40_4_ | (uint)!bVar20 * auVar135._40_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar141._44_4_ =
                           (uint)bVar20 * auVar136._44_4_ | (uint)!bVar20 * auVar135._44_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar141._48_4_ =
                           (uint)bVar20 * auVar136._48_4_ | (uint)!bVar20 * auVar135._48_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar141._52_4_ =
                           (uint)bVar20 * auVar136._52_4_ | (uint)!bVar20 * auVar135._52_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar141._56_4_ =
                           (uint)bVar20 * auVar136._56_4_ | (uint)!bVar20 * auVar135._56_4_;
                      bVar20 = SUB81(uVar70 >> 0xf,0);
                      auVar141._60_4_ =
                           (uint)bVar20 * auVar136._60_4_ | (uint)!bVar20 * auVar135._60_4_;
                      auVar142 = vfmadd231ps_avx512f(auVar142,auVar141,auVar128);
                      auVar142 = vfmadd231ps_avx512f(auVar142,auVar141,auVar129);
                      auVar135 = vmulps_avx512f(auVar142,auVar142);
                      auVar136 = vfmadd213ps_avx512f(auVar142,(undefined1  [64])afVar41,
                                                     (undefined1  [64])afVar42);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar142,(undefined1  [64])afVar43);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar142,(undefined1  [64])afVar44);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar142,(undefined1  [64])afVar45);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar142,(undefined1  [64])afVar46);
                      auVar142 = vfmadd213ps_avx512f(auVar136,auVar135,auVar142);
                      auVar142 = vaddps_avx512f(auVar142,(undefined1  [64])afVar37);
                      auVar141 = vcvttps2dq_avx512f(auVar141);
                      auVar141 = vpaddd_avx512f(auVar130,auVar141);
                      auVar141 = vpslld_avx512f(auVar141,0x17);
                      auVar142 = vfmadd213ps_avx512f(auVar141,auVar142,auVar132);
                      auVar141 = vmaxps_avx512f(auVar142,(undefined1  [64])_ps512_min_norm_pos);
                      auVar135 = vpsrld_avx512f(auVar141,0x17);
                      auVar141 = vpternlogd_avx512f(auVar141,(undefined1  [64])afVar46,
                                                    (undefined1  [64])_ps512_inv_mant_mask,0xec);
                      uVar70 = vcmpps_avx512f(auVar141,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                      auVar136 = vsubps_avx512f(auVar141,(undefined1  [64])afVar37);
                      auVar141 = vaddps_avx512f(auVar136,auVar141);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar137._0_4_ =
                           (uint)bVar20 * auVar141._0_4_ | (uint)!bVar20 * auVar136._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar137._4_4_ =
                           (uint)bVar20 * auVar141._4_4_ | (uint)!bVar20 * auVar136._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar137._8_4_ =
                           (uint)bVar20 * auVar141._8_4_ | (uint)!bVar20 * auVar136._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar137._12_4_ =
                           (uint)bVar20 * auVar141._12_4_ | (uint)!bVar20 * auVar136._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar137._16_4_ =
                           (uint)bVar20 * auVar141._16_4_ | (uint)!bVar20 * auVar136._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar137._20_4_ =
                           (uint)bVar20 * auVar141._20_4_ | (uint)!bVar20 * auVar136._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar137._24_4_ =
                           (uint)bVar20 * auVar141._24_4_ | (uint)!bVar20 * auVar136._24_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar137._28_4_ =
                           (uint)bVar20 * auVar141._28_4_ | (uint)!bVar20 * auVar136._28_4_;
                      bVar21 = (byte)(uVar70 >> 8);
                      bVar20 = (bool)(bVar21 & 1);
                      auVar137._32_4_ =
                           (uint)bVar20 * auVar141._32_4_ | (uint)!bVar20 * auVar136._32_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar137._36_4_ =
                           (uint)bVar20 * auVar141._36_4_ | (uint)!bVar20 * auVar136._36_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar137._40_4_ =
                           (uint)bVar20 * auVar141._40_4_ | (uint)!bVar20 * auVar136._40_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar137._44_4_ =
                           (uint)bVar20 * auVar141._44_4_ | (uint)!bVar20 * auVar136._44_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar137._48_4_ =
                           (uint)bVar20 * auVar141._48_4_ | (uint)!bVar20 * auVar136._48_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar137._52_4_ =
                           (uint)bVar20 * auVar141._52_4_ | (uint)!bVar20 * auVar136._52_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar137._56_4_ =
                           (uint)bVar20 * auVar141._56_4_ | (uint)!bVar20 * auVar136._56_4_;
                      bVar20 = SUB81(uVar70 >> 0xf,0);
                      auVar137._60_4_ =
                           (uint)bVar20 * auVar141._60_4_ | (uint)!bVar20 * auVar136._60_4_;
                      auVar141 = vmulps_avx512f(auVar137,auVar137);
                      auVar136 = vfmadd132ps_avx512f(auVar137,(undefined1  [64])_ps512_cephes_log_p1
                                                     ,(undefined1  [64])_ps512_cephes_log_p0);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar47);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar48);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar49);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar50);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar51);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar52);
                      auVar136 = vfmadd213ps_avx512f(auVar136,auVar137,(undefined1  [64])afVar53);
                      auVar138 = vmulps_avx512f(auVar141,auVar137);
                      auVar136 = vfmadd213ps_avx512f(auVar138,auVar136,auVar137);
                      uVar5 = vcmpps_avx512f(auVar142,auVar180,2);
                      auVar142 = vpsubd_avx512f(auVar135,auVar130);
                      auVar142 = vcvtdq2ps_avx512f(auVar142);
                      auVar135 = vaddps_avx512f(auVar142,(undefined1  [64])afVar37);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar138._0_4_ =
                           (uint)bVar20 * auVar142._0_4_ | (uint)!bVar20 * auVar135._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar138._4_4_ =
                           (uint)bVar20 * auVar142._4_4_ | (uint)!bVar20 * auVar135._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar138._8_4_ =
                           (uint)bVar20 * auVar142._8_4_ | (uint)!bVar20 * auVar135._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar138._12_4_ =
                           (uint)bVar20 * auVar142._12_4_ | (uint)!bVar20 * auVar135._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar138._16_4_ =
                           (uint)bVar20 * auVar142._16_4_ | (uint)!bVar20 * auVar135._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar138._20_4_ =
                           (uint)bVar20 * auVar142._20_4_ | (uint)!bVar20 * auVar135._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar138._24_4_ =
                           (uint)bVar20 * auVar142._24_4_ | (uint)!bVar20 * auVar135._24_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar138._28_4_ =
                           (uint)bVar20 * auVar142._28_4_ | (uint)!bVar20 * auVar135._28_4_;
                      bVar20 = (bool)(bVar21 & 1);
                      auVar138._32_4_ =
                           (uint)bVar20 * auVar142._32_4_ | (uint)!bVar20 * auVar135._32_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar138._36_4_ =
                           (uint)bVar20 * auVar142._36_4_ | (uint)!bVar20 * auVar135._36_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar138._40_4_ =
                           (uint)bVar20 * auVar142._40_4_ | (uint)!bVar20 * auVar135._40_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar138._44_4_ =
                           (uint)bVar20 * auVar142._44_4_ | (uint)!bVar20 * auVar135._44_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar138._48_4_ =
                           (uint)bVar20 * auVar142._48_4_ | (uint)!bVar20 * auVar135._48_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar138._52_4_ =
                           (uint)bVar20 * auVar142._52_4_ | (uint)!bVar20 * auVar135._52_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar138._56_4_ =
                           (uint)bVar20 * auVar142._56_4_ | (uint)!bVar20 * auVar135._56_4_;
                      bVar20 = SUB81(uVar70 >> 0xf,0);
                      auVar138._60_4_ =
                           (uint)bVar20 * auVar142._60_4_ | (uint)!bVar20 * auVar135._60_4_;
                      auVar142 = vfmadd231ps_avx512f(auVar136,auVar138,
                                                     (undefined1  [64])_ps512_cephes_log_q1);
                      auVar142 = vfmadd231ps_avx512f(auVar142,auVar131,auVar141);
                      auVar142 = vfmadd231ps_avx512f(auVar142,auVar138,
                                                     (undefined1  [64])_ps512_cephes_log_q2);
                      auVar142 = vmulps_avx512f(auVar142,auVar133);
                      auVar141 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                      bVar20 = (bool)((byte)uVar5 & 1);
                      auVar135._0_4_ =
                           (uint)bVar20 * auVar141._0_4_ | (uint)!bVar20 * auVar142._0_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 1) & 1);
                      auVar135._4_4_ =
                           (uint)bVar20 * auVar141._4_4_ | (uint)!bVar20 * auVar142._4_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 2) & 1);
                      auVar135._8_4_ =
                           (uint)bVar20 * auVar141._8_4_ | (uint)!bVar20 * auVar142._8_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 3) & 1);
                      auVar135._12_4_ =
                           (uint)bVar20 * auVar141._12_4_ | (uint)!bVar20 * auVar142._12_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 4) & 1);
                      auVar135._16_4_ =
                           (uint)bVar20 * auVar141._16_4_ | (uint)!bVar20 * auVar142._16_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 5) & 1);
                      auVar135._20_4_ =
                           (uint)bVar20 * auVar141._20_4_ | (uint)!bVar20 * auVar142._20_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 6) & 1);
                      auVar135._24_4_ =
                           (uint)bVar20 * auVar141._24_4_ | (uint)!bVar20 * auVar142._24_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 7) & 1);
                      auVar135._28_4_ =
                           (uint)bVar20 * auVar141._28_4_ | (uint)!bVar20 * auVar142._28_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 8) & 1);
                      auVar135._32_4_ =
                           (uint)bVar20 * auVar141._32_4_ | (uint)!bVar20 * auVar142._32_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 9) & 1);
                      auVar135._36_4_ =
                           (uint)bVar20 * auVar141._36_4_ | (uint)!bVar20 * auVar142._36_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 10) & 1);
                      auVar135._40_4_ =
                           (uint)bVar20 * auVar141._40_4_ | (uint)!bVar20 * auVar142._40_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 0xb) & 1);
                      auVar135._44_4_ =
                           (uint)bVar20 * auVar141._44_4_ | (uint)!bVar20 * auVar142._44_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 0xc) & 1);
                      auVar135._48_4_ =
                           (uint)bVar20 * auVar141._48_4_ | (uint)!bVar20 * auVar142._48_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 0xd) & 1);
                      auVar135._52_4_ =
                           (uint)bVar20 * auVar141._52_4_ | (uint)!bVar20 * auVar142._52_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 0xe) & 1);
                      auVar135._56_4_ =
                           (uint)bVar20 * auVar141._56_4_ | (uint)!bVar20 * auVar142._56_4_;
                      bVar20 = SUB81(uVar5 >> 0xf,0);
                      auVar135._60_4_ =
                           (uint)bVar20 * auVar141._60_4_ | (uint)!bVar20 * auVar142._60_4_;
                      auVar142 = vminps_avx512f(auVar135,(undefined1  [64])afVar38);
                      auVar142 = vmaxps_avx512f(auVar142,(undefined1  [64])afVar39);
                      auVar141 = vfmadd213ps_avx512f((undefined1  [64])afVar40,auVar142,
                                                     (undefined1  [64])afVar46);
                      auVar135 = vrndscaleps_avx512f(auVar141,1);
                      uVar70 = vcmpps_avx512f(auVar141,auVar135,1);
                      auVar141 = vsubps_avx512f(auVar135,(undefined1  [64])afVar37);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar136._0_4_ =
                           (uint)bVar20 * auVar141._0_4_ | (uint)!bVar20 * auVar135._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar136._4_4_ =
                           (uint)bVar20 * auVar141._4_4_ | (uint)!bVar20 * auVar135._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar136._8_4_ =
                           (uint)bVar20 * auVar141._8_4_ | (uint)!bVar20 * auVar135._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar136._12_4_ =
                           (uint)bVar20 * auVar141._12_4_ | (uint)!bVar20 * auVar135._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar136._16_4_ =
                           (uint)bVar20 * auVar141._16_4_ | (uint)!bVar20 * auVar135._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar136._20_4_ =
                           (uint)bVar20 * auVar141._20_4_ | (uint)!bVar20 * auVar135._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar136._24_4_ =
                           (uint)bVar20 * auVar141._24_4_ | (uint)!bVar20 * auVar135._24_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 7) & 1);
                      auVar136._28_4_ =
                           (uint)bVar20 * auVar141._28_4_ | (uint)!bVar20 * auVar135._28_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 8) & 1);
                      auVar136._32_4_ =
                           (uint)bVar20 * auVar141._32_4_ | (uint)!bVar20 * auVar135._32_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 9) & 1);
                      auVar136._36_4_ =
                           (uint)bVar20 * auVar141._36_4_ | (uint)!bVar20 * auVar135._36_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 10) & 1);
                      auVar136._40_4_ =
                           (uint)bVar20 * auVar141._40_4_ | (uint)!bVar20 * auVar135._40_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xb) & 1);
                      auVar136._44_4_ =
                           (uint)bVar20 * auVar141._44_4_ | (uint)!bVar20 * auVar135._44_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xc) & 1);
                      auVar136._48_4_ =
                           (uint)bVar20 * auVar141._48_4_ | (uint)!bVar20 * auVar135._48_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xd) & 1);
                      auVar136._52_4_ =
                           (uint)bVar20 * auVar141._52_4_ | (uint)!bVar20 * auVar135._52_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 0xe) & 1);
                      auVar136._56_4_ =
                           (uint)bVar20 * auVar141._56_4_ | (uint)!bVar20 * auVar135._56_4_;
                      bVar20 = SUB81(uVar70 >> 0xf,0);
                      auVar136._60_4_ =
                           (uint)bVar20 * auVar141._60_4_ | (uint)!bVar20 * auVar135._60_4_;
                      auVar142 = vfmadd231ps_avx512f(auVar142,auVar136,auVar128);
                      auVar142 = vfmadd231ps_avx512f(auVar142,auVar136,auVar129);
                      auVar141 = vmulps_avx512f(auVar142,auVar142);
                      auVar135 = vfmadd213ps_avx512f(auVar142,(undefined1  [64])afVar41,
                                                     (undefined1  [64])afVar42);
                      auVar135 = vfmadd213ps_avx512f(auVar135,auVar142,(undefined1  [64])afVar43);
                      auVar135 = vfmadd213ps_avx512f(auVar135,auVar142,(undefined1  [64])afVar44);
                      auVar135 = vfmadd213ps_avx512f(auVar135,auVar142,(undefined1  [64])afVar45);
                      auVar135 = vfmadd213ps_avx512f(auVar135,auVar142,(undefined1  [64])afVar46);
                      auVar142 = vfmadd213ps_avx512f(auVar135,auVar141,auVar142);
                      auVar142 = vaddps_avx512f(auVar142,(undefined1  [64])afVar37);
                      auVar141 = vcvttps2dq_avx512f(auVar136);
                      auVar141 = vpaddd_avx512f(auVar141,auVar130);
                      auVar141 = vpslld_avx512f(auVar141,0x17);
                      auVar142 = vfmadd213ps_avx512f(auVar141,auVar142,auVar132);
                      auVar141 = vrcp14ps_avx512f(auVar142);
                      auVar142 = vfmsub213ps_avx512f(auVar142,auVar141,auVar132);
                      auVar142 = vfnmadd132ps_avx512vl(auVar142,auVar141,auVar141);
                      auVar142 = vfnmsub213ps_avx512f(auVar142,auVar133,auVar132);
                      auVar134 = vmulps_avx512f(auVar142,auVar134);
                      break;
                    case 6:
                      auVar141 = vbroadcastss_avx512f
                                           (ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var64))
                                           );
                      uVar81 = (*(uint **)(&this->field_0x120 + (long)p_Var64))[1];
                      auVar142._4_4_ = uVar81;
                      auVar142._0_4_ = uVar81;
                      auVar142._8_4_ = uVar81;
                      auVar142._12_4_ = uVar81;
                      auVar142._16_4_ = uVar81;
                      auVar142._20_4_ = uVar81;
                      auVar142._24_4_ = uVar81;
                      auVar142._28_4_ = uVar81;
                      auVar142._32_4_ = uVar81;
                      auVar142._36_4_ = uVar81;
                      auVar142._40_4_ = uVar81;
                      auVar142._44_4_ = uVar81;
                      auVar142._48_4_ = uVar81;
                      auVar142._52_4_ = uVar81;
                      auVar142._56_4_ = uVar81;
                      auVar142._60_4_ = uVar81;
                      auVar142 = vfmadd213ps_avx512f(auVar141,auVar134,auVar142);
                      auVar142 = vmaxps_avx512f(auVar142,auVar180);
                      auVar142 = vminps_avx512f(auVar142,auVar132);
                      auVar134 = vmulps_avx512f(auVar142,auVar134);
                    }
                    *pauVar74 = auVar134;
                    pauVar74 = pauVar74 + 1;
                    iVar69 = iVar69 + 1;
                    local_2a8 = local_2a8 + 1;
                  } while (iVar69 != _w);
                }
                iVar61 = iVar61 + 1;
              } while (iVar61 != _h);
            }
            local_2f8 = local_2f8 + 1;
          } while (local_2f8 != uVar66);
        }
        goto LAB_00491557;
      }
      if (0 < (int)uVar81) {
        uVar11 = vpcmpd_avx512vl((undefined1  [16])0x0,local_138,1);
        local_2f8 = 0;
        auVar146._8_4_ = 0x42b0c0a5;
        auVar146._0_8_ = 0x42b0c0a542b0c0a5;
        auVar146._12_4_ = 0x42b0c0a5;
        auVar146._16_4_ = 0x42b0c0a5;
        auVar146._20_4_ = 0x42b0c0a5;
        auVar146._24_4_ = 0x42b0c0a5;
        auVar146._28_4_ = 0x42b0c0a5;
        auVar149._8_4_ = 0xc2b0c0a5;
        auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar149._12_4_ = 0xc2b0c0a5;
        auVar149._16_4_ = 0xc2b0c0a5;
        auVar149._20_4_ = 0xc2b0c0a5;
        auVar149._24_4_ = 0xc2b0c0a5;
        auVar149._28_4_ = 0xc2b0c0a5;
        auVar152._8_4_ = 0x3f000000;
        auVar152._0_8_ = 0x3f0000003f000000;
        auVar152._12_4_ = 0x3f000000;
        auVar152._16_4_ = 0x3f000000;
        auVar152._20_4_ = 0x3f000000;
        auVar152._24_4_ = 0x3f000000;
        auVar152._28_4_ = 0x3f000000;
        auVar154._8_4_ = 0x3fb8aa3b;
        auVar154._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar154._12_4_ = 0x3fb8aa3b;
        auVar154._16_4_ = 0x3fb8aa3b;
        auVar154._20_4_ = 0x3fb8aa3b;
        auVar154._24_4_ = 0x3fb8aa3b;
        auVar154._28_4_ = 0x3fb8aa3b;
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = 0x3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar156._16_4_ = 0x3f800000;
        auVar156._20_4_ = 0x3f800000;
        auVar156._24_4_ = 0x3f800000;
        auVar156._28_4_ = 0x3f800000;
        auVar158._8_4_ = 0x3f318000;
        auVar158._0_8_ = 0x3f3180003f318000;
        auVar158._12_4_ = 0x3f318000;
        auVar158._16_4_ = 0x3f318000;
        auVar158._20_4_ = 0x3f318000;
        auVar158._24_4_ = 0x3f318000;
        auVar158._28_4_ = 0x3f318000;
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar169._8_4_ = 0x3ab743ce;
        auVar169._0_8_ = 0x3ab743ce3ab743ce;
        auVar169._12_4_ = 0x3ab743ce;
        auVar169._16_4_ = 0x3ab743ce;
        auVar169._20_4_ = 0x3ab743ce;
        auVar169._24_4_ = 0x3ab743ce;
        auVar169._28_4_ = 0x3ab743ce;
        auVar171._8_4_ = 0x3c088908;
        auVar171._0_8_ = 0x3c0889083c088908;
        auVar171._12_4_ = 0x3c088908;
        auVar171._16_4_ = 0x3c088908;
        auVar171._20_4_ = 0x3c088908;
        auVar171._24_4_ = 0x3c088908;
        auVar171._28_4_ = 0x3c088908;
        auVar173._8_4_ = 0x3d2aa9c1;
        auVar173._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar173._12_4_ = 0x3d2aa9c1;
        auVar173._16_4_ = 0x3d2aa9c1;
        auVar173._20_4_ = 0x3d2aa9c1;
        auVar173._24_4_ = 0x3d2aa9c1;
        auVar173._28_4_ = 0x3d2aa9c1;
        auVar175._8_4_ = 0x3e2aaaaa;
        auVar175._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar175._12_4_ = 0x3e2aaaaa;
        auVar175._16_4_ = 0x3e2aaaaa;
        auVar175._20_4_ = 0x3e2aaaaa;
        auVar175._24_4_ = 0x3e2aaaaa;
        auVar175._28_4_ = 0x3e2aaaaa;
        auVar177._8_4_ = 0x3f800000;
        auVar177._0_8_ = 0x3f8000003f800000;
        auVar177._12_4_ = 0x3f800000;
        auVar177._16_4_ = 0x3f800000;
        auVar177._20_4_ = 0x3f800000;
        auVar177._24_4_ = 0x3f800000;
        auVar177._28_4_ = 0x3f800000;
        auVar179._8_4_ = 0xb95e8083;
        auVar179._0_8_ = 0xb95e8083b95e8083;
        auVar179._12_4_ = 0xb95e8083;
        auVar179._16_4_ = 0xb95e8083;
        auVar179._20_4_ = 0xb95e8083;
        auVar179._24_4_ = 0xb95e8083;
        auVar179._28_4_ = 0xb95e8083;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          if (((uVar11 & 0xf) >> 1 & 1) != 0) {
            pvVar17 = (this->weight_data_tm).data;
            sVar71 = bottom_blob->elemsize;
            local_208 = (void *)(bottom_blob->cstep * local_2f8 * sVar71 + (long)bottom_blob->data);
            iVar77 = bottom_blob->w;
            pauVar75 = (undefined1 (*) [32])
                       (local_258.cstep * local_2f8 * local_258.elemsize + (long)local_258.data);
            pp_Var15 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            iVar79 = 0;
            do {
              if ((uVar11 & 1) != 0) {
                iVar58 = 0;
                local_2a8 = -local_88._0_4_;
                do {
                  p_Var64 = pp_Var15[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var64) == 0) {
                    auVar144 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar144 = ZEXT3264(*(undefined1 (*) [32])
                                         (*(long *)(&this->field_0x1b0 + (long)p_Var64) +
                                         local_2f8 * 0x20));
                  }
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
                    iVar59 = 0;
                    iVar60 = 0;
                    do {
                      iVar62 = *(int *)(&this->field_0xe0 + (long)p_Var64) * iVar60 +
                               (iVar79 - local_88._4_4_);
                      if (((-1 < iVar62) &&
                          (iVar65 = iVar62 / *(int *)(&this->field_0xe8 + (long)p_Var64),
                          iVar62 % *(int *)(&this->field_0xe8 + (long)p_Var64) == 0)) &&
                         (iVar65 < iStack_1a4)) {
                        lVar67 = (long)*(int *)(&this->field_0xd4 + (long)p_Var64);
                        if (0 < lVar67) {
                          uVar78 = *(int *)(&this->field_0xd4 + (long)p_Var64) * iVar59;
                          iVar62 = local_2a8;
                          do {
                            if (((-1 < iVar62) &&
                                (iVar63 = iVar62 / *(int *)(&this->field_0xe4 + (long)p_Var64),
                                iVar62 % *(int *)(&this->field_0xe4 + (long)p_Var64) == 0)) &&
                               (iVar63 < local_1a8)) {
                              auVar82 = vfmadd231ps_fma(auVar144._0_32_,
                                                        *(undefined1 (*) [32])
                                                         ((long)local_208 +
                                                         (long)(iVar63 << 3) * 4 +
                                                         (long)iVar65 * (long)iVar77 * sVar71),
                                                        *(undefined1 (*) [32])
                                                         ((long)pvVar17 +
                                                         (ulong)uVar78 * 4 +
                                                         (long)(int)(uVar72 * 8 * (int)local_2f8) *
                                                         4));
                              auVar144 = ZEXT1664(auVar82);
                            }
                            uVar78 = uVar78 + 8;
                            iVar62 = iVar62 + *(int *)(&this->field_0xdc + (long)p_Var64);
                            lVar67 = lVar67 + -1;
                          } while (lVar67 != 0);
                        }
                      }
                      iVar60 = iVar60 + 1;
                      iVar59 = iVar59 + 8;
                    } while (iVar60 != *(int *)(&this->field_0xd8 + (long)p_Var64));
                  }
                  auVar127 = auVar144._0_32_;
                  if (*(int *)(&this->field_0x118 + (long)p_Var64) - 1U < 6) {
                    auVar121 = ZEXT1632((undefined1  [16])0x0);
                    auVar128._28_36_ = auVar144._28_36_;
                    switch(*(int *)(&this->field_0x118 + (long)p_Var64)) {
                    case 1:
                      auVar127 = vmaxps_avx(auVar127,ZEXT1632((undefined1  [16])0x0));
                      break;
                    case 2:
                      auVar118 = vmaxps_avx(auVar127,auVar121);
                      auVar127 = vminps_avx(auVar127,auVar121);
                      uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                      auVar34._4_4_ = uVar1;
                      auVar34._0_4_ = uVar1;
                      auVar34._8_4_ = uVar1;
                      auVar34._12_4_ = uVar1;
                      auVar34._16_4_ = uVar1;
                      auVar34._20_4_ = uVar1;
                      auVar34._24_4_ = uVar1;
                      auVar34._28_4_ = uVar1;
                      auVar127 = vfmadd132ps_avx512vl(auVar127,auVar118,auVar34);
                      break;
                    case 3:
                      uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                      auVar32._4_4_ = uVar1;
                      auVar32._0_4_ = uVar1;
                      auVar32._8_4_ = uVar1;
                      auVar32._12_4_ = uVar1;
                      auVar32._16_4_ = uVar1;
                      auVar32._20_4_ = uVar1;
                      auVar32._24_4_ = uVar1;
                      auVar32._28_4_ = uVar1;
                      auVar127 = vmaxps_avx512vl(auVar127,auVar32);
                      uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var64))[1];
                      auVar33._4_4_ = uVar1;
                      auVar33._0_4_ = uVar1;
                      auVar33._8_4_ = uVar1;
                      auVar33._12_4_ = uVar1;
                      auVar33._16_4_ = uVar1;
                      auVar33._20_4_ = uVar1;
                      auVar33._24_4_ = uVar1;
                      auVar33._28_4_ = uVar1;
                      auVar127 = vminps_avx512vl(auVar127,auVar33);
                      break;
                    case 4:
                      auVar30._8_4_ = 0x80000000;
                      auVar30._0_8_ = 0x8000000080000000;
                      auVar30._12_4_ = 0x80000000;
                      auVar30._16_4_ = 0x80000000;
                      auVar30._20_4_ = 0x80000000;
                      auVar30._24_4_ = 0x80000000;
                      auVar30._28_4_ = 0x80000000;
                      auVar127 = vxorps_avx512vl(auVar127,auVar30);
                      auVar127 = vminps_avx(auVar127,auVar146);
                      auVar127 = vmaxps_avx(auVar127,auVar149);
                      auVar82 = vfmadd231ps_fma(auVar152,auVar127,auVar154);
                      auVar121 = vrndscaleps_avx512vl(ZEXT1632(auVar82),1);
                      uVar70 = vcmpps_avx512vl(ZEXT1632(auVar82),auVar121,1);
                      auVar118 = vsubps_avx512vl(auVar121,auVar156);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar126._0_4_ =
                           (uint)bVar20 * auVar118._0_4_ | (uint)!bVar20 * auVar121._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar126._4_4_ =
                           (uint)bVar20 * auVar118._4_4_ | (uint)!bVar20 * auVar121._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar126._8_4_ =
                           (uint)bVar20 * auVar118._8_4_ | (uint)!bVar20 * auVar121._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar126._12_4_ =
                           (uint)bVar20 * auVar118._12_4_ | (uint)!bVar20 * auVar121._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar126._16_4_ =
                           (uint)bVar20 * auVar118._16_4_ | (uint)!bVar20 * auVar121._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar126._20_4_ =
                           (uint)bVar20 * auVar118._20_4_ | (uint)!bVar20 * auVar121._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar126._24_4_ =
                           (uint)bVar20 * auVar118._24_4_ | (uint)!bVar20 * auVar121._24_4_;
                      bVar20 = SUB81(uVar70 >> 7,0);
                      auVar126._28_4_ =
                           (uint)bVar20 * auVar118._28_4_ | (uint)!bVar20 * auVar121._28_4_;
                      auVar127 = vfmsub231ps_avx512vl(auVar127,auVar126,auVar158);
                      auVar31._8_4_ = 0x395e8083;
                      auVar31._0_8_ = 0x395e8083395e8083;
                      auVar31._12_4_ = 0x395e8083;
                      auVar31._16_4_ = 0x395e8083;
                      auVar31._20_4_ = 0x395e8083;
                      auVar31._24_4_ = 0x395e8083;
                      auVar31._28_4_ = 0x395e8083;
                      auVar127 = vfmsub231ps_avx512vl(auVar127,auVar126,auVar31);
                      auVar161._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar161._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar161._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar161._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar161._16_4_ = auVar127._16_4_ * auVar127._16_4_;
                      auVar161._20_4_ = auVar127._20_4_ * auVar127._20_4_;
                      auVar161._24_4_ = auVar127._24_4_ * auVar127._24_4_;
                      auVar161._28_4_ = 0;
                      auVar82 = vfmadd213ps_fma(auVar105,auVar127,auVar169);
                      auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar127,auVar171);
                      auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar127,auVar173);
                      auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar127,auVar175);
                      auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar127,auVar152);
                      auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar161,auVar127);
                      auVar162._0_4_ = auVar82._0_4_ + 1.0;
                      auVar162._4_4_ = auVar82._4_4_ + 1.0;
                      auVar162._8_4_ = auVar82._8_4_ + 1.0;
                      auVar162._12_4_ = auVar82._12_4_ + 1.0;
                      auVar162._16_4_ = 0x3f800000;
                      auVar162._20_4_ = 0x3f800000;
                      auVar162._24_4_ = 0x3f800000;
                      auVar162._28_4_ = 0x3f800000;
                      auVar127 = vcvttps2dq_avx512vl(auVar126);
                      auVar127 = vpslld_avx2(auVar127,0x17);
                      auVar127 = vpaddd_avx2(auVar177,auVar127);
                      auVar82 = vfmadd213ps_fma(auVar127,auVar162,auVar156);
                      auVar127 = vrcpps_avx(ZEXT1632(auVar82));
                      auVar82 = vfmsub213ps_fma(ZEXT1632(auVar82),auVar127,auVar156);
                      auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar127,auVar127);
                      auVar127 = ZEXT1632(auVar82);
                      break;
                    case 5:
                      auVar127 = vminps_avx(auVar127,auVar146);
                      auVar127 = vmaxps_avx(auVar127,auVar149);
                      auVar82 = vfmadd213ps_fma(auVar154,auVar127,auVar152);
                      auVar118 = vrndscaleps_avx512vl(ZEXT1632(auVar82),1);
                      uVar70 = vcmpps_avx512vl(ZEXT1632(auVar82),auVar118,1);
                      auVar119 = vsubps_avx512vl(auVar118,auVar156);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar120._0_4_ =
                           (uint)bVar20 * auVar119._0_4_ | (uint)!bVar20 * auVar118._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar120._4_4_ =
                           (uint)bVar20 * auVar119._4_4_ | (uint)!bVar20 * auVar118._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar120._8_4_ =
                           (uint)bVar20 * auVar119._8_4_ | (uint)!bVar20 * auVar118._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar120._12_4_ =
                           (uint)bVar20 * auVar119._12_4_ | (uint)!bVar20 * auVar118._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar120._16_4_ =
                           (uint)bVar20 * auVar119._16_4_ | (uint)!bVar20 * auVar118._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar120._20_4_ =
                           (uint)bVar20 * auVar119._20_4_ | (uint)!bVar20 * auVar118._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar120._24_4_ =
                           (uint)bVar20 * auVar119._24_4_ | (uint)!bVar20 * auVar118._24_4_;
                      bVar20 = SUB81(uVar70 >> 7,0);
                      auVar120._28_4_ =
                           (uint)bVar20 * auVar119._28_4_ | (uint)!bVar20 * auVar118._28_4_;
                      auVar127 = vfmsub231ps_avx512vl(auVar127,auVar120,auVar158);
                      auVar127 = vfnmsub231ps_avx512vl(auVar127,auVar120,auVar179);
                      auVar166._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar166._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar166._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar166._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar166._16_4_ = auVar127._16_4_ * auVar127._16_4_;
                      auVar166._20_4_ = auVar127._20_4_ * auVar127._20_4_;
                      auVar166._24_4_ = auVar127._24_4_ * auVar127._24_4_;
                      auVar166._28_4_ = 0;
                      auVar118 = vfmadd213ps_avx512vl(auVar105,auVar127,auVar169);
                      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar127,auVar171);
                      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar127,auVar173);
                      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar127,auVar175);
                      auVar118 = vfmadd213ps_avx512vl(auVar118,auVar127,auVar152);
                      auVar127 = vfmadd213ps_avx512vl(auVar118,auVar166,auVar127);
                      auVar118 = vaddps_avx512vl(auVar127,auVar156);
                      auVar127 = vcvttps2dq_avx512vl(auVar120);
                      auVar127 = vpslld_avx2(auVar127,0x17);
                      auVar127 = vpaddd_avx2(auVar127,auVar177);
                      auVar82 = vfmadd213ps_fma(auVar127,auVar118,auVar156);
                      uVar70 = vcmpps_avx512vl(ZEXT1632(auVar82),auVar121,2);
                      auVar127._8_4_ = 0x800000;
                      auVar127._0_8_ = 0x80000000800000;
                      auVar127._12_4_ = 0x800000;
                      auVar127._16_4_ = 0x800000;
                      auVar127._20_4_ = 0x800000;
                      auVar127._24_4_ = 0x800000;
                      auVar127._28_4_ = 0x800000;
                      auVar127 = vmaxps_avx512vl(ZEXT1632(auVar82),auVar127);
                      auVar119 = vpsrld_avx2(auVar127,0x17);
                      auVar118 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                      auVar121._8_4_ = 0x3f000000;
                      auVar121._0_8_ = 0x3f0000003f000000;
                      auVar121._12_4_ = 0x3f000000;
                      auVar121._16_4_ = 0x3f000000;
                      auVar121._20_4_ = 0x3f000000;
                      auVar121._24_4_ = 0x3f000000;
                      auVar121._28_4_ = 0x3f000000;
                      auVar127 = vpternlogd_avx512vl(auVar127,auVar118,auVar121,0xea);
                      uVar5 = vcmpps_avx512vl(auVar127,auVar106,1);
                      auVar121 = vaddps_avx512vl(auVar127,auVar107);
                      auVar127 = vaddps_avx512vl(auVar121,auVar127);
                      bVar20 = (bool)((byte)uVar5 & 1);
                      auVar122._0_4_ =
                           (uint)bVar20 * auVar127._0_4_ | (uint)!bVar20 * auVar121._0_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 1) & 1);
                      auVar122._4_4_ =
                           (uint)bVar20 * auVar127._4_4_ | (uint)!bVar20 * auVar121._4_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 2) & 1);
                      auVar122._8_4_ =
                           (uint)bVar20 * auVar127._8_4_ | (uint)!bVar20 * auVar121._8_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 3) & 1);
                      auVar122._12_4_ =
                           (uint)bVar20 * auVar127._12_4_ | (uint)!bVar20 * auVar121._12_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 4) & 1);
                      auVar122._16_4_ =
                           (uint)bVar20 * auVar127._16_4_ | (uint)!bVar20 * auVar121._16_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 5) & 1);
                      auVar122._20_4_ =
                           (uint)bVar20 * auVar127._20_4_ | (uint)!bVar20 * auVar121._20_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 6) & 1);
                      auVar122._24_4_ =
                           (uint)bVar20 * auVar127._24_4_ | (uint)!bVar20 * auVar121._24_4_;
                      bVar20 = SUB81(uVar5 >> 7,0);
                      auVar122._28_4_ =
                           (uint)bVar20 * auVar127._28_4_ | (uint)!bVar20 * auVar121._28_4_;
                      auVar121 = vmulps_avx512vl(auVar122,auVar122);
                      auVar127 = vfmadd213ps_avx512vl(auVar108,auVar122,auVar109);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar110);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar111);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar112);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar113);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar114);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar115);
                      auVar127 = vfmadd213ps_avx512vl(auVar127,auVar122,auVar116);
                      auVar118 = vmulps_avx512vl(auVar121,auVar122);
                      auVar118 = vmulps_avx512vl(auVar118,auVar127);
                      auVar29._8_4_ = 0xffffff82;
                      auVar29._0_8_ = 0xffffff82ffffff82;
                      auVar29._12_4_ = 0xffffff82;
                      auVar29._16_4_ = 0xffffff82;
                      auVar29._20_4_ = 0xffffff82;
                      auVar29._24_4_ = 0xffffff82;
                      auVar29._28_4_ = 0xffffff82;
                      auVar127 = vpaddd_avx512vl(auVar119,auVar29);
                      auVar127 = vcvtdq2ps_avx(auVar127);
                      auVar119 = vsubps_avx512vl(auVar127,auVar156);
                      bVar20 = (bool)((byte)uVar5 & 1);
                      auVar123._0_4_ =
                           (uint)bVar20 * auVar119._0_4_ | (uint)!bVar20 * auVar127._0_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 1) & 1);
                      auVar123._4_4_ =
                           (uint)bVar20 * auVar119._4_4_ | (uint)!bVar20 * auVar127._4_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 2) & 1);
                      auVar123._8_4_ =
                           (uint)bVar20 * auVar119._8_4_ | (uint)!bVar20 * auVar127._8_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 3) & 1);
                      auVar123._12_4_ =
                           (uint)bVar20 * auVar119._12_4_ | (uint)!bVar20 * auVar127._12_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 4) & 1);
                      auVar123._16_4_ =
                           (uint)bVar20 * auVar119._16_4_ | (uint)!bVar20 * auVar127._16_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 5) & 1);
                      auVar123._20_4_ =
                           (uint)bVar20 * auVar119._20_4_ | (uint)!bVar20 * auVar127._20_4_;
                      bVar20 = (bool)((byte)(uVar5 >> 6) & 1);
                      auVar123._24_4_ =
                           (uint)bVar20 * auVar119._24_4_ | (uint)!bVar20 * auVar127._24_4_;
                      bVar20 = SUB81(uVar5 >> 7,0);
                      auVar123._28_4_ =
                           (uint)bVar20 * auVar119._28_4_ | (uint)!bVar20 * auVar127._28_4_;
                      auVar127 = vfmadd231ps_avx512vl(auVar118,auVar123,auVar179);
                      auVar127 = vfmsub231ps_avx512vl(auVar127,auVar152,auVar121);
                      auVar127 = vsubps_avx512vl(auVar127,auVar122);
                      auVar82 = vfmsub231ps_fma(auVar127,auVar158,auVar123);
                      auVar127 = vmulps_avx512vl(ZEXT1632(auVar82),auVar117);
                      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar124._0_4_ =
                           (uint)bVar20 * auVar121._0_4_ | (uint)!bVar20 * auVar127._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar124._4_4_ =
                           (uint)bVar20 * auVar121._4_4_ | (uint)!bVar20 * auVar127._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar124._8_4_ =
                           (uint)bVar20 * auVar121._8_4_ | (uint)!bVar20 * auVar127._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar124._12_4_ =
                           (uint)bVar20 * auVar121._12_4_ | (uint)!bVar20 * auVar127._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar124._16_4_ =
                           (uint)bVar20 * auVar121._16_4_ | (uint)!bVar20 * auVar127._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar124._20_4_ =
                           (uint)bVar20 * auVar121._20_4_ | (uint)!bVar20 * auVar127._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar124._24_4_ =
                           (uint)bVar20 * auVar121._24_4_ | (uint)!bVar20 * auVar127._24_4_;
                      bVar20 = SUB81(uVar70 >> 7,0);
                      auVar124._28_4_ =
                           (uint)bVar20 * auVar121._28_4_ | (uint)!bVar20 * auVar127._28_4_;
                      auVar127 = vminps_avx(auVar124,auVar146);
                      auVar127 = vmaxps_avx(auVar127,auVar149);
                      auVar82 = vfmadd213ps_fma(auVar154,auVar127,auVar152);
                      auVar121 = vrndscaleps_avx512vl(ZEXT1632(auVar82),1);
                      uVar70 = vcmpps_avx512vl(ZEXT1632(auVar82),auVar121,1);
                      auVar118 = vsubps_avx512vl(auVar121,auVar156);
                      bVar20 = (bool)((byte)uVar70 & 1);
                      auVar125._0_4_ =
                           (uint)bVar20 * auVar118._0_4_ | (uint)!bVar20 * auVar121._0_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                      auVar125._4_4_ =
                           (uint)bVar20 * auVar118._4_4_ | (uint)!bVar20 * auVar121._4_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                      auVar125._8_4_ =
                           (uint)bVar20 * auVar118._8_4_ | (uint)!bVar20 * auVar121._8_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                      auVar125._12_4_ =
                           (uint)bVar20 * auVar118._12_4_ | (uint)!bVar20 * auVar121._12_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 4) & 1);
                      auVar125._16_4_ =
                           (uint)bVar20 * auVar118._16_4_ | (uint)!bVar20 * auVar121._16_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 5) & 1);
                      auVar125._20_4_ =
                           (uint)bVar20 * auVar118._20_4_ | (uint)!bVar20 * auVar121._20_4_;
                      bVar20 = (bool)((byte)(uVar70 >> 6) & 1);
                      auVar125._24_4_ =
                           (uint)bVar20 * auVar118._24_4_ | (uint)!bVar20 * auVar121._24_4_;
                      bVar20 = SUB81(uVar70 >> 7,0);
                      auVar125._28_4_ =
                           (uint)bVar20 * auVar118._28_4_ | (uint)!bVar20 * auVar121._28_4_;
                      auVar127 = vfmsub231ps_avx512vl(auVar127,auVar125,auVar158);
                      auVar127 = vfnmsub231ps_avx512vl(auVar127,auVar125,auVar179);
                      auVar167._0_4_ = auVar127._0_4_ * auVar127._0_4_;
                      auVar167._4_4_ = auVar127._4_4_ * auVar127._4_4_;
                      auVar167._8_4_ = auVar127._8_4_ * auVar127._8_4_;
                      auVar167._12_4_ = auVar127._12_4_ * auVar127._12_4_;
                      auVar167._16_4_ = auVar127._16_4_ * auVar127._16_4_;
                      auVar167._20_4_ = auVar127._20_4_ * auVar127._20_4_;
                      auVar167._24_4_ = auVar127._24_4_ * auVar127._24_4_;
                      auVar167._28_4_ = 0;
                      auVar121 = vfmadd213ps_avx512vl(auVar105,auVar127,auVar169);
                      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar127,auVar171);
                      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar127,auVar173);
                      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar127,auVar175);
                      auVar121 = vfmadd213ps_avx512vl(auVar121,auVar127,auVar152);
                      auVar127 = vfmadd213ps_avx512vl(auVar121,auVar167,auVar127);
                      auVar121 = vaddps_avx512vl(auVar127,auVar156);
                      auVar127 = vcvttps2dq_avx512vl(auVar125);
                      auVar127 = vpslld_avx2(auVar127,0x17);
                      auVar127 = vpaddd_avx2(auVar127,auVar177);
                      auVar82 = vfmadd213ps_fma(auVar127,auVar121,auVar156);
                      auVar127 = vrcpps_avx(ZEXT1632(auVar82));
                      auVar82 = vfmsub213ps_fma(ZEXT1632(auVar82),auVar127,auVar156);
                      auVar82 = vfnmadd132ps_fma(ZEXT1632(auVar82),auVar127,auVar127);
                      auVar127 = vfnmadd213ps_avx512vl(ZEXT1632(auVar82),auVar117,auVar107);
                      auVar128._0_4_ = auVar127._0_4_ * auVar144._0_4_;
                      auVar128._4_4_ = auVar127._4_4_ * auVar144._4_4_;
                      auVar128._8_4_ = auVar127._8_4_ * auVar144._8_4_;
                      auVar128._12_4_ = auVar127._12_4_ * auVar144._12_4_;
                      auVar128._16_4_ = auVar127._16_4_ * auVar144._16_4_;
                      auVar128._20_4_ = auVar127._20_4_ * auVar144._20_4_;
                      auVar128._24_4_ = auVar127._24_4_ * auVar144._24_4_;
                      auVar127 = auVar128._0_32_;
                      break;
                    case 6:
                      uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                      auVar119._4_4_ = uVar1;
                      auVar119._0_4_ = uVar1;
                      auVar119._8_4_ = uVar1;
                      auVar119._12_4_ = uVar1;
                      auVar119._16_4_ = uVar1;
                      auVar119._20_4_ = uVar1;
                      auVar119._24_4_ = uVar1;
                      auVar119._28_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var64))[1];
                      auVar118._4_4_ = uVar1;
                      auVar118._0_4_ = uVar1;
                      auVar118._8_4_ = uVar1;
                      auVar118._12_4_ = uVar1;
                      auVar118._16_4_ = uVar1;
                      auVar118._20_4_ = uVar1;
                      auVar118._24_4_ = uVar1;
                      auVar118._28_4_ = uVar1;
                      auVar127 = vfmadd213ps_avx512vl(auVar119,auVar127,auVar118);
                      auVar127 = vmaxps_avx(auVar127,auVar121);
                      auVar127 = vminps_avx(auVar127,auVar156);
                      auVar129._0_4_ = auVar127._0_4_ * auVar144._0_4_;
                      auVar129._4_4_ = auVar127._4_4_ * auVar144._4_4_;
                      auVar129._8_4_ = auVar127._8_4_ * auVar144._8_4_;
                      auVar129._12_4_ = auVar127._12_4_ * auVar144._12_4_;
                      auVar129._16_4_ = auVar127._16_4_ * auVar144._16_4_;
                      auVar129._20_4_ = auVar127._20_4_ * auVar144._20_4_;
                      auVar129._24_4_ = auVar127._24_4_ * auVar144._24_4_;
                      auVar129._28_36_ = auVar128._28_36_;
                      auVar127 = auVar129._0_32_;
                    }
                  }
                  *pauVar75 = auVar127;
                  pauVar75 = pauVar75 + 1;
                  iVar58 = iVar58 + 1;
                  local_2a8 = local_2a8 + 1;
                } while (iVar58 != _w);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != _h);
          }
          local_2f8 = local_2f8 + 1;
        } while (local_2f8 != uVar66);
      }
    }
    if (iVar80 == 1) {
      if (0 < (int)uVar81) {
        lVar67 = local_258.cstep * local_258.elemsize;
        pvVar17 = (this->weight_data_tm).data;
        iVar80 = bottom_blob->w;
        pvVar18 = bottom_blob->data;
        sVar71 = bottom_blob->elemsize;
        sVar19 = bottom_blob->cstep;
        uVar11 = vpcmpd_avx512vl((undefined1  [16])0x0,local_138,1);
        uVar70 = 1;
        if (1 < (int)uVar81) {
          uVar70 = uVar66;
        }
        local_138._0_8_ = uVar70;
        local_1a8 = (int)((long)(int)uVar72 << 2);
        iStack_1a4 = (int)((ulong)((long)(int)uVar72 << 2) >> 0x20);
        iVar77 = -local_88._0_4_;
        local_2e0 = 0;
        do {
          if (((uVar11 & 0xf) >> 1 & 1) != 0) {
            local_208 = (void *)(sVar19 * sVar71 * local_2e0 + (long)pvVar18);
            pfVar68 = (float *)(lVar67 * local_2e0 + (long)pvVar14);
            pp_Var15 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            iVar79 = 0;
            do {
              if ((uVar11 & 1) != 0) {
                iVar58 = 0;
                local_2d8 = iVar77;
                do {
                  p_Var64 = pp_Var15[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var64) == 0) {
                    auVar144 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar144 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var64) +
                                                local_2e0 * 4));
                  }
                  auVar82 = auVar144._0_16_;
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
                    iVar59 = 0;
                    do {
                      iVar60 = *(int *)(&this->field_0xe0 + (long)p_Var64) * iVar59 +
                               (iVar79 - uVar2);
                      if (((-1 < iVar60) &&
                          (iVar62 = iVar60 / *(int *)(&this->field_0xe8 + (long)p_Var64),
                          iVar60 % *(int *)(&this->field_0xe8 + (long)p_Var64) == 0)) &&
                         (iVar62 < iVar69)) {
                        iVar60 = *(int *)(&this->field_0xd4 + (long)p_Var64);
                        if (0 < (long)iVar60) {
                          lVar73 = 0;
                          iVar65 = local_2d8;
                          do {
                            if (((-1 < iVar65) &&
                                (iVar63 = iVar65 / *(int *)(&this->field_0xe4 + (long)p_Var64),
                                iVar65 % *(int *)(&this->field_0xe4 + (long)p_Var64) == 0)) &&
                               (iVar63 < iVar61)) {
                              auVar82 = vfmadd231ss_fma(auVar144._0_16_,
                                                        ZEXT416(*(uint *)((long)pvVar17 +
                                                                         lVar73 * 4 +
                                                                         (ulong)(uint)(iVar60 * 
                                                  iVar59) * 4)),
                                                  ZEXT416(*(uint *)((long)local_208 +
                                                                   (long)iVar63 * 4 +
                                                                   (long)iVar62 *
                                                                   (long)iVar80 * sVar71)));
                              auVar144 = ZEXT1664(auVar82);
                            }
                            lVar73 = lVar73 + 1;
                            iVar65 = iVar65 + *(int *)(&this->field_0xdc + (long)p_Var64);
                          } while (iVar60 != lVar73);
                        }
                      }
                      auVar82 = auVar144._0_16_;
                      iVar59 = iVar59 + 1;
                    } while (iVar59 != *(int *)(&this->field_0xd8 + (long)p_Var64));
                  }
                  fVar150 = auVar82._0_4_;
                  fVar143 = fVar150;
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var64)) {
                  case 1:
                    auVar82 = vmaxss_avx(auVar82,ZEXT416(0));
                    fVar143 = auVar82._0_4_;
                    break;
                  case 2:
                    uVar22 = vcmpss_avx512f(auVar82,ZEXT416(0),0xe);
                    bVar20 = (bool)((byte)uVar22 & 1);
                    fVar143 = (float)((uint)bVar20 * 0x3f800000 +
                                     (uint)!bVar20 * **(int **)(&this->field_0x120 + (long)p_Var64))
                              * fVar150;
                    break;
                  case 3:
                    fVar150 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var64))[1];
                    auVar82 = vmaxss_avx(auVar82,ZEXT416(**(uint **)(&this->field_0x120 +
                                                                    (long)p_Var64)));
                    fVar143 = auVar82._0_4_;
                    if (fVar150 < auVar82._0_4_) {
                      fVar143 = fVar150;
                    }
                    break;
                  case 4:
                    auVar82 = vminss_avx(auVar82,SUB6416(ZEXT464(0x42b0c0a5),0));
                    auVar90._8_4_ = 0x80000000;
                    auVar90._0_8_ = 0x8000000080000000;
                    auVar90._12_4_ = 0x80000000;
                    auVar83 = vxorps_avx512vl(auVar82,auVar90);
                    uVar22 = vcmpss_avx512f(auVar82,ZEXT416(0xc2b0c0a5),1);
                    bVar20 = (bool)((byte)uVar22 & 1);
                    fVar143 = expf((float)((uint)bVar20 * 0x42b0c0a5 + (uint)!bVar20 * auVar83._0_4_
                                          ));
                    fVar143 = 1.0 / (fVar143 + 1.0);
                    break;
                  case 5:
                    fVar143 = expf(fVar150);
                    fVar143 = logf(fVar143 + 1.0);
                    fVar143 = tanhf(fVar143);
                    fVar143 = fVar143 * fVar150;
                    break;
                  case 6:
                    fVar3 = **(float **)(&this->field_0x120 + (long)p_Var64);
                    auVar85._8_4_ = 0x80000000;
                    auVar85._0_8_ = 0x8000000080000000;
                    auVar85._12_4_ = 0x80000000;
                    auVar84 = ZEXT416((uint)(*(float **)(&this->field_0x120 + (long)p_Var64))[1]);
                    auVar83 = vxorps_avx512vl(auVar84,auVar85);
                    fVar147 = auVar83._0_4_ / fVar3;
                    fVar143 = 0.0;
                    if ((fVar147 <= fVar150) &&
                       (fVar143 = fVar150, fVar150 <= fVar147 + 1.0 / fVar3)) {
                      auVar82 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar82,auVar84);
                      fVar143 = auVar82._0_4_ * fVar150;
                    }
                  }
                  *pfVar68 = fVar143;
                  pfVar68 = pfVar68 + 1;
                  iVar58 = iVar58 + 1;
                  local_2d8 = local_2d8 + 1;
                } while (iVar58 != _w);
              }
              iVar79 = iVar79 + 1;
            } while (iVar79 != _h);
          }
          local_2e0 = local_2e0 + 1;
          pvVar17 = (void *)((long)pvVar17 + CONCAT44(iStack_1a4,local_1a8));
        } while (local_2e0 != local_138._0_8_);
      }
    }
    else if ((iVar80 == 4) && (0 < (int)uVar81)) {
      uVar11 = vpcmpd_avx512vl((undefined1  [16])0x0,local_138,1);
      local_2f8 = 0;
      auVar145._8_4_ = 0x42b0c0a5;
      auVar145._0_8_ = 0x42b0c0a542b0c0a5;
      auVar145._12_4_ = 0x42b0c0a5;
      auVar148._8_4_ = 0xc2b0c0a5;
      auVar148._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar148._12_4_ = 0xc2b0c0a5;
      auVar151._8_4_ = 0x3f000000;
      auVar151._0_8_ = 0x3f0000003f000000;
      auVar151._12_4_ = 0x3f000000;
      auVar153._8_4_ = 0x3fb8aa3b;
      auVar153._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar153._12_4_ = 0x3fb8aa3b;
      auVar155._8_4_ = 0x3f800000;
      auVar155._0_8_ = 0x3f8000003f800000;
      auVar155._12_4_ = 0x3f800000;
      auVar157._8_4_ = 0x3f318000;
      auVar157._0_8_ = 0x3f3180003f318000;
      auVar157._12_4_ = 0x3f318000;
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar168._8_4_ = 0x3ab743ce;
      auVar168._0_8_ = 0x3ab743ce3ab743ce;
      auVar168._12_4_ = 0x3ab743ce;
      auVar170._8_4_ = 0x3c088908;
      auVar170._0_8_ = 0x3c0889083c088908;
      auVar170._12_4_ = 0x3c088908;
      auVar172._8_4_ = 0x3d2aa9c1;
      auVar172._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar172._12_4_ = 0x3d2aa9c1;
      auVar174._8_4_ = 0x3e2aaaaa;
      auVar174._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar174._12_4_ = 0x3e2aaaaa;
      auVar176._8_4_ = 0x3f800000;
      auVar176._0_8_ = 0x3f8000003f800000;
      auVar176._12_4_ = 0x3f800000;
      auVar178._8_4_ = 0xb95e8083;
      auVar178._0_8_ = 0xb95e8083b95e8083;
      auVar178._12_4_ = 0xb95e8083;
      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar84 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar86 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar90 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        if (((uVar11 & 0xf) >> 1 & 1) != 0) {
          pvVar14 = (this->weight_data_tm).data;
          sVar71 = bottom_blob->elemsize;
          local_208 = (void *)(bottom_blob->cstep * local_2f8 * sVar71 + (long)bottom_blob->data);
          iVar80 = bottom_blob->w;
          pauVar76 = (undefined1 (*) [16])
                     (local_258.cstep * local_2f8 * local_258.elemsize + (long)local_258.data);
          pp_Var15 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
          iVar61 = 0;
          do {
            if ((uVar11 & 1) != 0) {
              iVar69 = 0;
              local_2a8 = -local_88._0_4_;
              do {
                p_Var64 = pp_Var15[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var64) == 0) {
                  auVar144 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar144 = ZEXT1664(*(undefined1 (*) [16])
                                       (*(long *)(&this->field_0x1b0 + (long)p_Var64) +
                                       local_2f8 * 0x10));
                }
                auVar102 = auVar144._0_16_;
                if (0 < *(int *)(&this->field_0xd8 + (long)p_Var64)) {
                  iVar79 = 0;
                  iVar77 = 0;
                  do {
                    iVar58 = *(int *)(&this->field_0xe0 + (long)p_Var64) * iVar77 +
                             (iVar61 - local_88._4_4_);
                    if (((-1 < iVar58) &&
                        (iVar59 = iVar58 / *(int *)(&this->field_0xe8 + (long)p_Var64),
                        iVar58 % *(int *)(&this->field_0xe8 + (long)p_Var64) == 0)) &&
                       (iVar59 < iStack_1a4)) {
                      lVar67 = (long)*(int *)(&this->field_0xd4 + (long)p_Var64);
                      if (0 < lVar67) {
                        uVar81 = *(int *)(&this->field_0xd4 + (long)p_Var64) * iVar79;
                        iVar58 = local_2a8;
                        do {
                          if (((-1 < iVar58) &&
                              (iVar60 = iVar58 / *(int *)(&this->field_0xe4 + (long)p_Var64),
                              iVar58 % *(int *)(&this->field_0xe4 + (long)p_Var64) == 0)) &&
                             (iVar60 < local_1a8)) {
                            auVar102 = vfmadd231ps_fma(auVar144._0_16_,
                                                       *(undefined1 (*) [16])
                                                        ((long)local_208 +
                                                        (long)(iVar60 << 2) * 4 +
                                                        (long)iVar59 * (long)iVar80 * sVar71),
                                                       *(undefined1 (*) [16])
                                                        ((long)pvVar14 +
                                                        (ulong)uVar81 * 4 +
                                                        (long)(int)(uVar72 * 4 * (int)local_2f8) * 4
                                                        ));
                            auVar144 = ZEXT1664(auVar102);
                          }
                          uVar81 = uVar81 + 4;
                          iVar58 = iVar58 + *(int *)(&this->field_0xdc + (long)p_Var64);
                          lVar67 = lVar67 + -1;
                        } while (lVar67 != 0);
                      }
                    }
                    auVar102 = auVar144._0_16_;
                    iVar77 = iVar77 + 1;
                    iVar79 = iVar79 + 4;
                  } while (iVar77 != *(int *)(&this->field_0xd8 + (long)p_Var64));
                }
                switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var64)) {
                case 1:
                  auVar102 = vmaxps_avx(auVar102,(undefined1  [16])0x0);
                  break;
                case 2:
                  auVar104 = vmaxps_avx(auVar102,(undefined1  [16])0x0);
                  auVar102 = vminps_avx(auVar102,(undefined1  [16])0x0);
                  uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                  auVar28._4_4_ = uVar2;
                  auVar28._0_4_ = uVar2;
                  auVar28._8_4_ = uVar2;
                  auVar28._12_4_ = uVar2;
                  auVar102 = vfmadd132ps_avx512vl(auVar102,auVar104,auVar28);
                  break;
                case 3:
                  uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                  auVar26._4_4_ = uVar2;
                  auVar26._0_4_ = uVar2;
                  auVar26._8_4_ = uVar2;
                  auVar26._12_4_ = uVar2;
                  auVar102 = vmaxps_avx512vl(auVar102,auVar26);
                  uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var64))[1];
                  auVar27._4_4_ = uVar2;
                  auVar27._0_4_ = uVar2;
                  auVar27._8_4_ = uVar2;
                  auVar27._12_4_ = uVar2;
                  auVar102 = vminps_avx512vl(auVar102,auVar27);
                  break;
                case 4:
                  auVar25._8_4_ = 0x80000000;
                  auVar25._0_8_ = 0x8000000080000000;
                  auVar25._12_4_ = 0x80000000;
                  auVar102 = vxorps_avx512vl(auVar102,auVar25);
                  auVar102 = vminps_avx(auVar102,auVar145);
                  auVar102 = vmaxps_avx(auVar102,auVar148);
                  auVar104 = vfmadd231ps_fma(auVar151,auVar102,auVar153);
                  auVar96 = vcvttps2dq_avx512vl(auVar104);
                  auVar96 = vcvtdq2ps_avx512vl(auVar96);
                  uVar70 = vcmpps_avx512vl(auVar104,auVar96,1);
                  auVar104 = vsubps_avx512vl(auVar96,auVar155);
                  bVar20 = (bool)((byte)uVar70 & 1);
                  auVar103._0_4_ = (uint)bVar20 * auVar104._0_4_ | (uint)!bVar20 * auVar96._0_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar103._4_4_ = (uint)bVar20 * auVar104._4_4_ | (uint)!bVar20 * auVar96._4_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar103._8_4_ = (uint)bVar20 * auVar104._8_4_ | (uint)!bVar20 * auVar96._8_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar103._12_4_ = (uint)bVar20 * auVar104._12_4_ | (uint)!bVar20 * auVar96._12_4_;
                  auVar104 = vfmsub231ps_avx512vl(auVar102,auVar103,auVar157);
                  auVar102._8_4_ = 0x395e8083;
                  auVar102._0_8_ = 0x395e8083395e8083;
                  auVar102._12_4_ = 0x395e8083;
                  auVar104 = vfmsub231ps_avx512vl(auVar104,auVar103,auVar102);
                  auVar159._0_4_ = auVar104._0_4_ * auVar104._0_4_;
                  auVar159._4_4_ = auVar104._4_4_ * auVar104._4_4_;
                  auVar159._8_4_ = auVar104._8_4_ * auVar104._8_4_;
                  auVar159._12_4_ = auVar104._12_4_ * auVar104._12_4_;
                  auVar102 = vfmadd213ps_fma(auVar82,auVar104,auVar168);
                  auVar102 = vfmadd213ps_fma(auVar102,auVar104,auVar170);
                  auVar102 = vfmadd213ps_fma(auVar102,auVar104,auVar172);
                  auVar102 = vfmadd213ps_fma(auVar102,auVar104,auVar174);
                  auVar102 = vfmadd213ps_fma(auVar102,auVar104,auVar151);
                  auVar102 = vfmadd213ps_fma(auVar102,auVar159,auVar104);
                  auVar160._0_4_ = auVar102._0_4_ + 1.0;
                  auVar160._4_4_ = auVar102._4_4_ + 1.0;
                  auVar160._8_4_ = auVar102._8_4_ + 1.0;
                  auVar160._12_4_ = auVar102._12_4_ + 1.0;
                  auVar102 = vcvttps2dq_avx512vl(auVar103);
                  auVar102 = vpslld_avx(auVar102,0x17);
                  auVar102 = vpaddd_avx(auVar176,auVar102);
                  auVar104 = vfmadd213ps_fma(auVar102,auVar160,auVar155);
                  auVar102 = vrcpps_avx(auVar104);
                  auVar104 = vfmsub213ps_fma(auVar104,auVar102,auVar155);
                  auVar102 = vfnmadd132ps_fma(auVar104,auVar102,auVar102);
                  break;
                case 5:
                  auVar104 = vminps_avx(auVar102,auVar145);
                  auVar104 = vmaxps_avx(auVar104,auVar148);
                  auVar96 = vfmadd213ps_fma(auVar153,auVar104,auVar151);
                  auVar95 = vcvttps2dq_avx512vl(auVar96);
                  auVar95 = vcvtdq2ps_avx512vl(auVar95);
                  uVar70 = vcmpps_avx512vl(auVar96,auVar95,1);
                  auVar96 = vsubps_avx512vl(auVar95,auVar155);
                  bVar20 = (bool)((byte)uVar70 & 1);
                  auVar97._0_4_ = (uint)bVar20 * auVar96._0_4_ | (uint)!bVar20 * auVar95._0_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar97._4_4_ = (uint)bVar20 * auVar96._4_4_ | (uint)!bVar20 * auVar95._4_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar97._8_4_ = (uint)bVar20 * auVar96._8_4_ | (uint)!bVar20 * auVar95._8_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar97._12_4_ = (uint)bVar20 * auVar96._12_4_ | (uint)!bVar20 * auVar95._12_4_;
                  auVar104 = vfmsub231ps_avx512vl(auVar104,auVar97,auVar157);
                  auVar104 = vfnmsub231ps_avx512vl(auVar104,auVar97,auVar178);
                  auVar163._0_4_ = auVar104._0_4_ * auVar104._0_4_;
                  auVar163._4_4_ = auVar104._4_4_ * auVar104._4_4_;
                  auVar163._8_4_ = auVar104._8_4_ * auVar104._8_4_;
                  auVar163._12_4_ = auVar104._12_4_ * auVar104._12_4_;
                  auVar96 = vfmadd213ps_avx512vl(auVar82,auVar104,auVar168);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar170);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar172);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar174);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar151);
                  auVar104 = vfmadd213ps_avx512vl(auVar96,auVar163,auVar104);
                  auVar96 = vaddps_avx512vl(auVar104,auVar155);
                  auVar104 = vcvttps2dq_avx512vl(auVar97);
                  auVar104 = vpslld_avx(auVar104,0x17);
                  auVar104 = vpaddd_avx(auVar104,auVar176);
                  auVar104 = vfmadd213ps_fma(auVar104,auVar96,auVar155);
                  uVar70 = vcmpps_avx512vl(auVar104,(undefined1  [16])0x0,2);
                  auVar164._8_4_ = 0x800000;
                  auVar164._0_8_ = 0x80000000800000;
                  auVar164._12_4_ = 0x800000;
                  auVar104 = vmaxps_avx512vl(auVar104,auVar164);
                  auVar164 = vpsrld_avx(auVar104,0x17);
                  auVar96 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                  auVar23._8_4_ = 0x3f000000;
                  auVar23._0_8_ = 0x3f0000003f000000;
                  auVar23._12_4_ = 0x3f000000;
                  auVar104 = vpternlogd_avx512vl(auVar104,auVar96,auVar23,0xea);
                  uVar5 = vcmpps_avx512vl(auVar104,auVar83,1);
                  auVar96 = vaddps_avx512vl(auVar104,auVar84);
                  auVar104 = vaddps_avx512vl(auVar96,auVar104);
                  bVar20 = (bool)((byte)uVar5 & 1);
                  auVar98._0_4_ = (uint)bVar20 * auVar104._0_4_ | (uint)!bVar20 * auVar96._0_4_;
                  bVar20 = (bool)((byte)(uVar5 >> 1) & 1);
                  auVar98._4_4_ = (uint)bVar20 * auVar104._4_4_ | (uint)!bVar20 * auVar96._4_4_;
                  bVar20 = (bool)((byte)(uVar5 >> 2) & 1);
                  auVar98._8_4_ = (uint)bVar20 * auVar104._8_4_ | (uint)!bVar20 * auVar96._8_4_;
                  bVar20 = (bool)((byte)(uVar5 >> 3) & 1);
                  auVar98._12_4_ = (uint)bVar20 * auVar104._12_4_ | (uint)!bVar20 * auVar96._12_4_;
                  auVar96 = vmulps_avx512vl(auVar98,auVar98);
                  auVar104 = vfmadd213ps_avx512vl(auVar85,auVar98,auVar86);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar87);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar88);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar89);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar90);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar91);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar92);
                  auVar104 = vfmadd213ps_avx512vl(auVar104,auVar98,auVar93);
                  auVar95 = vmulps_avx512vl(auVar96,auVar98);
                  auVar95 = vmulps_avx512vl(auVar95,auVar104);
                  auVar24._8_4_ = 0xffffff82;
                  auVar24._0_8_ = 0xffffff82ffffff82;
                  auVar24._12_4_ = 0xffffff82;
                  auVar104 = vpaddd_avx512vl(auVar164,auVar24);
                  auVar104 = vcvtdq2ps_avx(auVar104);
                  auVar164 = vsubps_avx512vl(auVar104,auVar155);
                  bVar20 = (bool)((byte)uVar5 & 1);
                  auVar99._0_4_ = (uint)bVar20 * auVar164._0_4_ | (uint)!bVar20 * auVar104._0_4_;
                  bVar20 = (bool)((byte)(uVar5 >> 1) & 1);
                  auVar99._4_4_ = (uint)bVar20 * auVar164._4_4_ | (uint)!bVar20 * auVar104._4_4_;
                  bVar20 = (bool)((byte)(uVar5 >> 2) & 1);
                  auVar99._8_4_ = (uint)bVar20 * auVar164._8_4_ | (uint)!bVar20 * auVar104._8_4_;
                  bVar20 = (bool)((byte)(uVar5 >> 3) & 1);
                  auVar99._12_4_ = (uint)bVar20 * auVar164._12_4_ | (uint)!bVar20 * auVar104._12_4_;
                  auVar104 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar178);
                  auVar104 = vfmsub231ps_avx512vl(auVar104,auVar151,auVar96);
                  auVar104 = vsubps_avx512vl(auVar104,auVar98);
                  auVar104 = vfnmadd231ps_fma(auVar104,auVar157,auVar99);
                  auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  bVar20 = (bool)((byte)uVar70 & 1);
                  auVar100._0_4_ =
                       (uint)bVar20 * auVar96._0_4_ |
                       (uint)!bVar20 * (int)(auVar104._0_4_ + auVar104._0_4_);
                  bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar100._4_4_ =
                       (uint)bVar20 * auVar96._4_4_ |
                       (uint)!bVar20 * (int)(auVar104._4_4_ + auVar104._4_4_);
                  bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar100._8_4_ =
                       (uint)bVar20 * auVar96._8_4_ |
                       (uint)!bVar20 * (int)(auVar104._8_4_ + auVar104._8_4_);
                  bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar100._12_4_ =
                       (uint)bVar20 * auVar96._12_4_ |
                       (uint)!bVar20 * (int)(auVar104._12_4_ + auVar104._12_4_);
                  auVar104 = vminps_avx(auVar100,auVar145);
                  auVar104 = vmaxps_avx(auVar104,auVar148);
                  auVar96 = vfmadd213ps_fma(auVar153,auVar104,auVar151);
                  auVar95 = vcvttps2dq_avx512vl(auVar96);
                  auVar95 = vcvtdq2ps_avx512vl(auVar95);
                  uVar70 = vcmpps_avx512vl(auVar96,auVar95,1);
                  auVar96 = vsubps_avx512vl(auVar95,auVar155);
                  bVar20 = (bool)((byte)uVar70 & 1);
                  auVar101._0_4_ = (uint)bVar20 * auVar96._0_4_ | (uint)!bVar20 * auVar95._0_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar101._4_4_ = (uint)bVar20 * auVar96._4_4_ | (uint)!bVar20 * auVar95._4_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar101._8_4_ = (uint)bVar20 * auVar96._8_4_ | (uint)!bVar20 * auVar95._8_4_;
                  bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar101._12_4_ = (uint)bVar20 * auVar96._12_4_ | (uint)!bVar20 * auVar95._12_4_;
                  auVar104 = vfmsub231ps_avx512vl(auVar104,auVar101,auVar157);
                  auVar104 = vfnmsub231ps_avx512vl(auVar104,auVar101,auVar178);
                  auVar165._0_4_ = auVar104._0_4_ * auVar104._0_4_;
                  auVar165._4_4_ = auVar104._4_4_ * auVar104._4_4_;
                  auVar165._8_4_ = auVar104._8_4_ * auVar104._8_4_;
                  auVar165._12_4_ = auVar104._12_4_ * auVar104._12_4_;
                  auVar96 = vfmadd213ps_avx512vl(auVar82,auVar104,auVar168);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar170);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar172);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar174);
                  auVar96 = vfmadd213ps_avx512vl(auVar96,auVar104,auVar151);
                  auVar104 = vfmadd213ps_avx512vl(auVar96,auVar165,auVar104);
                  auVar96 = vaddps_avx512vl(auVar104,auVar155);
                  auVar104 = vcvttps2dq_avx512vl(auVar101);
                  auVar104 = vpslld_avx(auVar104,0x17);
                  auVar104 = vpaddd_avx(auVar104,auVar176);
                  auVar96 = vfmadd213ps_fma(auVar104,auVar96,auVar155);
                  auVar104 = vrcpps_avx(auVar96);
                  auVar95 = vaddps_avx512vl(auVar104,auVar104);
                  auVar96 = vfmsub213ps_avx512vl(auVar96,auVar95,auVar94);
                  auVar104 = vfnmadd213ps_avx512vl(auVar96,auVar104,auVar95);
                  auVar102 = vfmsub231ps_fma(auVar102,auVar102,auVar104);
                  break;
                case 6:
                  uVar2 = **(undefined4 **)(&this->field_0x120 + (long)p_Var64);
                  auVar95._4_4_ = uVar2;
                  auVar95._0_4_ = uVar2;
                  auVar95._8_4_ = uVar2;
                  auVar95._12_4_ = uVar2;
                  uVar2 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var64))[1];
                  auVar104._4_4_ = uVar2;
                  auVar104._0_4_ = uVar2;
                  auVar104._8_4_ = uVar2;
                  auVar104._12_4_ = uVar2;
                  auVar104 = vfmadd213ps_avx512vl(auVar95,auVar102,auVar104);
                  auVar104 = vmaxps_avx(auVar104,(undefined1  [16])0x0);
                  auVar104 = vminps_avx(auVar104,auVar155);
                  auVar96._0_4_ = auVar104._0_4_ * auVar102._0_4_;
                  auVar96._4_4_ = auVar104._4_4_ * auVar102._4_4_;
                  auVar96._8_4_ = auVar104._8_4_ * auVar102._8_4_;
                  auVar96._12_4_ = auVar104._12_4_ * auVar102._12_4_;
                  auVar102 = auVar96;
                }
                *pauVar76 = auVar102;
                pauVar76 = pauVar76 + 1;
                iVar69 = iVar69 + 1;
                local_2a8 = local_2a8 + 1;
              } while (iVar69 != _w);
            }
            iVar61 = iVar61 + 1;
          } while (iVar61 != _h);
        }
        local_2f8 = local_2f8 + 1;
      } while (local_2f8 != uVar66);
    }
  }
  else {
    uVar11 = (long)(int)(uVar81 * iVar80) / (long)iVar77;
    uVar70 = (long)*(int *)(&this->field_0xd0 + (long)p_Var64) / (long)iVar77;
    local_2d8 = 1;
    local_2c8 = 1;
    if (opt->use_packing_layout == true) {
      local_2c8 = 0x10;
      local_2d8 = 0x10;
      if ((uVar11 & 0xf) != 0) {
        if ((uVar11 & 7) == 0) {
          local_2d8 = 8;
        }
        else {
          local_2d8 = (uint)((uVar11 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar70 & 0xf) != 0) {
        if ((uVar70 & 7) == 0) {
          local_2c8 = 8;
        }
        else {
          local_2c8 = (uint)((uVar70 & 3) == 0) * 3 + 1;
        }
      }
    }
    local_208._0_4_ = (int)uVar70;
    piVar13 = bottom_blob->refcount;
    local_188._0_8_ = bottom_blob->data;
    local_188._8_4_ = SUB84(bottom_blob->refcount,0);
    local_188._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
    local_188._16_8_ = bottom_blob->elemsize;
    local_188._24_4_ = bottom_blob->elempack;
    local_188._32_8_ = bottom_blob->allocator;
    local_160._0_4_ = bottom_blob->dims;
    local_160._4_4_ = bottom_blob->w;
    local_160._8_4_ = bottom_blob->h;
    local_160._12_4_ = bottom_blob->d;
    local_150 = bottom_blob->c;
    local_148 = bottom_blob->cstep;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    if (local_2d8 < iVar80) {
      auVar144 = vmovdqu64_avx512f((undefined1  [64])*opt);
      auVar144 = vmovdqu64_avx512f(auVar144);
      stack0xfffffffffffffe18 = auVar144._16_48_;
      local_1f8._0_8_ = auVar144._0_8_;
      local_1f8._8_8_ = opt->workspace_allocator;
      convert_packing(bottom_blob,(Mat *)local_188,local_2d8,(Option *)local_1f8);
    }
    auVar55 = stack0xfffffffffffffe18;
    piVar13 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
    local_1f8._12_4_ = local_258.refcount._4_4_;
    local_1f8._8_4_ = local_258.refcount._0_4_;
    local_1f8._0_8_ = local_258.data;
    local_1f8._16_8_ = local_258.elemsize;
    auStack_1dc = auVar55._12_36_;
    iStack_1e0 = local_258.elempack;
    pAStack_1d8 = local_258.allocator;
    uStack_1d0._4_1_ = (bool)(undefined1)local_258.w;
    uStack_1d0._5_1_ = (bool)local_258.w._1_1_;
    uStack_1d0._6_1_ = (bool)local_258.w._2_1_;
    uStack_1d0._7_1_ = (bool)local_258.w._3_1_;
    uStack_1d0._0_1_ = (bool)(undefined1)local_258.dims;
    uStack_1d0._1_1_ = (bool)local_258.dims._1_1_;
    uStack_1d0._2_1_ = (bool)local_258.dims._2_1_;
    uStack_1d0._3_1_ = (bool)local_258.dims._3_1_;
    _iStack_1c8 = local_258._48_8_;
    auStack_1dc._32_4_ = auVar55._44_4_;
    iStack_1c0._0_1_ = (bool)(undefined1)local_258.c;
    iStack_1c0._1_1_ = (bool)local_258.c._1_1_;
    iStack_1c0._2_1_ = (bool)local_258.c._2_1_;
    iStack_1c0._3_1_ = (bool)local_258.c._3_1_;
    local_1b8 = local_258.cstep;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    if (local_2c8 < uVar72) {
      Mat::create((Mat *)local_1f8,_w,_h,
                  *(int *)(&this->field_0xd0 +
                          (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]) / (int)local_2c8,
                  (ulong)local_2c8 * (sVar71 / uVar72),local_2c8,opt->workspace_allocator);
      auVar56 = auStack_1dc;
      if (((void *)local_1f8._0_8_ == (void *)0x0) || ((long)iStack_1c0 * local_1b8 == 0)) {
        iVar80 = -100;
        auStack_1dc = auVar56;
        if ((Allocator *)local_1f8._8_8_ != (Allocator *)0x0) {
          LOCK();
          *(int *)(_func_int ***)local_1f8._8_8_ = *(int *)(_func_int ***)local_1f8._8_8_ + -1;
          UNLOCK();
          if (*(int *)(_func_int ***)local_1f8._8_8_ == 0) {
            if (pAStack_1d8 == (Allocator *)0x0) {
              if ((void *)local_1f8._0_8_ != (void *)0x0) {
                free((void *)local_1f8._0_8_);
              }
            }
            else {
              (*pAStack_1d8->_vptr_Allocator[3])();
            }
          }
        }
        auVar56 = auStack_1dc;
        local_1b8 = 0;
        local_1f8._0_12_ = SUB1612((undefined1  [16])0x0,0);
        _local_1f8 = ZEXT1228(local_1f8._0_12_);
        auStack_1dc._32_4_ = auVar56._32_4_;
        _local_1f8 = ZEXT4060(_local_1f8);
        piVar13 = (int *)CONCAT44(local_188._12_4_,local_188._8_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if ((Allocator *)local_188._32_8_ == (Allocator *)0x0) {
              if ((void *)local_188._0_8_ != (void *)0x0) {
                free((void *)local_188._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_188._32_8_)[3])();
            }
          }
        }
        local_148 = 0;
        local_188._0_8_ = (void *)0x0;
        local_188._8_4_ = 0;
        local_188._12_4_ = 0;
        local_188._16_8_ = 0;
        local_188._24_4_ = 0;
        local_160 = (undefined1  [16])0x0;
        local_150 = 0;
        goto LAB_00491655;
      }
    }
    if (0 < *(int *)(&this->field_0x114 + (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]))
    {
      iVar80 = (int)local_208 / (int)local_2c8;
      iVar61 = 0;
      iVar69 = 0;
      lVar67 = 0;
      do {
        local_d8 = (void *)((long)(iVar61 / local_2d8) * local_148 * local_188._16_8_ +
                           local_188._0_8_);
        uStack_d0 = 0;
        uStack_cc = 0;
        local_c8 = local_188._16_8_;
        local_c0 = local_188._24_4_;
        local_b8 = (Allocator *)local_188._32_8_;
        local_98 = ((long)(int)local_160._12_4_ * local_188._16_8_ *
                    (long)(int)local_160._8_4_ * (long)(int)local_160._4_4_ + 0xfU &
                   0xfffffffffffffff0) / (ulong)local_188._16_8_;
        local_b0 = local_160;
        local_128 = (void *)((long)(iVar69 / (int)local_2c8) * local_1b8 * local_1f8._16_8_ +
                            local_1f8._0_8_);
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = (Allocator *)local_1f8._16_8_;
        local_110 = iStack_1e0;
        local_108 = pAStack_1d8;
        local_e8 = ((long)iStack_1c4 * local_1f8._16_8_ * (long)iStack_1c8 * (long)uStack_1d0._4_4_
                    + 0xfU & 0xfffffffffffffff0) / (ulong)local_1f8._16_8_;
        local_100 = local_1f8._40_16_;
        pLVar16 = (this->group_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar67];
        auVar144 = vmovdqu64_avx512f((undefined1  [64])*opt);
        auVar144 = vmovdqu64_avx512f(auVar144);
        auStack_68 = auVar144._16_48_;
        local_78 = auVar144._0_8_;
        pAStack_70 = pAStack_1d8;
        local_f0 = iVar80;
        local_a0 = (int)uVar11 / local_2d8;
        (*pLVar16->_vptr_Layer[7])(pLVar16,&local_d8,&local_128,&local_78);
        piVar13 = (int *)CONCAT44(uStack_11c,uStack_120);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_108 == (Allocator *)0x0) {
              if (local_128 != (void *)0x0) {
                free(local_128);
              }
            }
            else {
              (*local_108->_vptr_Allocator[3])();
            }
          }
        }
        local_e8 = 0;
        local_128 = (void *)0x0;
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = (Allocator *)0x0;
        local_110 = 0;
        local_100 = (undefined1  [16])0x0;
        local_f0 = 0;
        piVar13 = (int *)CONCAT44(uStack_cc,uStack_d0);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_b8 == (Allocator *)0x0) {
              if (local_d8 != (void *)0x0) {
                free(local_d8);
              }
            }
            else {
              (*local_b8->_vptr_Allocator[3])();
            }
          }
        }
        local_98 = 0;
        local_d8 = (void *)0x0;
        uStack_d0 = 0;
        uStack_cc = 0;
        local_c8 = 0;
        local_c0 = 0;
        local_b0 = (undefined1  [16])0x0;
        local_a0 = 0;
        lVar67 = lVar67 + 1;
        iVar69 = iVar69 + (int)local_208;
        iVar61 = iVar61 + (int)uVar11;
      } while (lVar67 < *(int *)(&this->field_0x114 +
                                (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]));
    }
    if (local_2c8 < uVar72) {
      convert_packing((Mat *)local_1f8,&local_258,uVar72,opt);
    }
    else {
      if ((Allocator *)local_1f8._8_8_ != (Allocator *)0x0) {
        LOCK();
        *(int *)(_func_int ***)local_1f8._8_8_ = *(int *)(_func_int ***)local_1f8._8_8_ + 1;
        UNLOCK();
      }
      piVar13 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            if (local_258.data != (void *)0x0) {
              free(local_258.data);
            }
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      OVar54 = _local_1f8;
      local_258.data = (void *)local_1f8._0_8_;
      local_258.refcount._0_4_ = local_1f8._8_4_;
      local_258.refcount._4_4_ = local_1f8._12_4_;
      local_258.elemsize = local_1f8._16_8_;
      local_258.elempack = iStack_1e0;
      local_258.allocator = pAStack_1d8;
      local_258.dims = local_1f8._40_4_;
      local_258.w = local_1f8._44_4_;
      local_258.h = iStack_1c8;
      local_258.d = iStack_1c4;
      iStack_1c0 = OVar54._56_4_;
      local_258.c = iStack_1c0;
      local_258.cstep = local_1b8;
      _local_1f8 = OVar54;
    }
    if ((Allocator *)local_1f8._8_8_ != (Allocator *)0x0) {
      LOCK();
      *(int *)(_func_int ***)local_1f8._8_8_ = *(int *)(_func_int ***)local_1f8._8_8_ + -1;
      UNLOCK();
      if (*(int *)(_func_int ***)local_1f8._8_8_ == 0) {
        if (pAStack_1d8 == (Allocator *)0x0) {
          if ((void *)local_1f8._0_8_ != (void *)0x0) {
            free((void *)local_1f8._0_8_);
          }
        }
        else {
          (*pAStack_1d8->_vptr_Allocator[3])();
        }
      }
    }
    auVar56 = auStack_1dc;
    local_1b8 = 0;
    local_1f8._0_12_ = SUB1612((undefined1  [16])0x0,0);
    _local_1f8 = ZEXT1228(local_1f8._0_12_);
    auStack_1dc._32_4_ = auVar56._32_4_;
    _local_1f8 = ZEXT4060(_local_1f8);
    piVar13 = (int *)CONCAT44(local_188._12_4_,local_188._8_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if ((Allocator *)local_188._32_8_ == (Allocator *)0x0) {
          if ((void *)local_188._0_8_ != (void *)0x0) {
            free((void *)local_188._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_188._32_8_)[3])();
        }
      }
    }
    local_148 = 0;
    local_188._0_8_ = (void *)0x0;
    local_188._8_4_ = 0;
    local_188._12_4_ = 0;
    local_188._16_8_ = 0;
    local_188._24_4_ = 0;
    local_160 = (undefined1  [16])0x0;
    local_150 = 0;
  }
LAB_00491557:
  pMVar57 = local_140;
  DeconvolutionDepthWise::cut_padding
            ((DeconvolutionDepthWise *)
             ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 +
             (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]),&local_258,local_140,opt);
  iVar80 = -100;
  if ((pMVar57->data != (void *)0x0) && (iVar80 = -100, (long)pMVar57->c * pMVar57->cstep != 0)) {
    iVar80 = 0;
  }
LAB_00491655:
  piVar13 = (int *)CONCAT44(local_258.refcount._4_4_,local_258.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_258.allocator == (Allocator *)0x0) {
        if (local_258.data != (void *)0x0) {
          free(local_258.data);
        }
      }
      else {
        (*(local_258.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar80;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}